

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  uint uVar3;
  vfloat<4> vVar4;
  uint uVar5;
  BVH *bvh;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  long lVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  bool bVar21;
  uint uVar22;
  undefined4 uVar23;
  int iVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  long lVar26;
  long lVar27;
  size_t sVar28;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  long lVar32;
  char *pcVar33;
  ulong uVar34;
  long lVar35;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar36;
  ulong uVar37;
  char *pcVar38;
  long lVar39;
  char *pcVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  Primitive_conflict3 *prim;
  NodeRef root;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar72;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  float fVar71;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  float fVar73;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar98;
  undefined1 auVar97 [64];
  float fVar99;
  float fVar119;
  float fVar121;
  vint4 ai_2;
  undefined1 auVar100 [16];
  float fVar123;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar120;
  float fVar122;
  float fVar124;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  vint4 bi_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  vint4 bi_3;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  vint4 bi;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar163;
  float fVar170;
  float fVar171;
  float fVar173;
  vint4 bi_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar174;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar172;
  float fVar175;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar176;
  undefined1 auVar178 [16];
  float fVar177;
  float fVar192;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar190;
  float fVar191;
  undefined1 auVar189 [64];
  float fVar193;
  float fVar204;
  float fVar206;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar208;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar205;
  float fVar207;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar213;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar214;
  float fVar215;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar216;
  float fVar217;
  float fVar223;
  float fVar225;
  float fVar226;
  undefined1 auVar218 [16];
  float fVar224;
  float fVar227;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar228;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  float fVar237;
  float fVar239;
  vint4 ai;
  undefined1 auVar235 [16];
  float fVar238;
  float fVar240;
  float fVar241;
  undefined1 auVar236 [16];
  float fVar242;
  float fVar243;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  vint4 ai_1;
  undefined1 auVar244 [16];
  float fVar250;
  undefined1 auVar245 [16];
  float fVar251;
  float fVar252;
  float fVar255;
  float fVar256;
  vint4 ai_3;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar262;
  float fVar263;
  undefined1 auVar260 [16];
  float fVar264;
  undefined1 auVar261 [16];
  float local_1c78;
  float fStack_1c74;
  float fStack_1c70;
  undefined1 local_1c68 [8];
  float fStack_1c60;
  float fStack_1c5c;
  float local_1c58;
  float fStack_1c54;
  float fStack_1c50;
  RTCFilterFunctionNArguments args;
  undefined1 local_1c08 [8];
  float fStack_1c00;
  float fStack_1bfc;
  char *local_1bf0;
  undefined8 uStack_1bd0;
  undefined1 local_1b98 [8];
  float fStack_1b90;
  float fStack_1b8c;
  undefined1 local_1b88 [16];
  NodeRef *local_1b78;
  RayK<4> *local_1b70;
  char *local_1b68;
  long local_1b60;
  char *local_1b58;
  char *local_1b50;
  char *local_1b48;
  char *local_1b40;
  char *local_1b38;
  char *local_1b30;
  undefined1 local_1b28 [8];
  undefined8 uStack_1b20;
  undefined1 local_1b18 [8];
  float fStack_1b10;
  float fStack_1b0c;
  vbool<4> terminated;
  Precalculations pre;
  char *local_1ad0;
  char *local_1ac8;
  char *local_1ac0;
  undefined1 local_1ab8 [8];
  float fStack_1ab0;
  float fStack_1aac;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1a38;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined1 local_19f8 [8];
  float fStack_19f0;
  float fStack_19ec;
  undefined1 local_19e8 [8];
  float fStack_19e0;
  float fStack_19dc;
  undefined1 local_19d8 [16];
  uint local_19c8;
  uint uStack_19c4;
  uint uStack_19c0;
  uint uStack_19bc;
  uint uStack_19b8;
  uint uStack_19b4;
  uint uStack_19b0;
  uint uStack_19ac;
  undefined1 local_19a8 [8];
  float fStack_19a0;
  float fStack_199c;
  undefined1 local_1998 [8];
  float fStack_1990;
  float fStack_198c;
  vint<4> vitime;
  TravRayK<4,_false> tray;
  uint local_1868;
  uint uStack_1864;
  uint uStack_1860;
  uint uStack_185c;
  uint local_1848;
  uint uStack_1844;
  uint uStack_1840;
  uint uStack_183c;
  undefined1 local_1838 [16];
  undefined1 local_1828 [16];
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [8];
  float fStack_17e0;
  float fStack_17dc;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined1 local_1778 [8];
  float fStack_1770;
  float fStack_176c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1720;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar222 [16];
  
  uVar20 = mm_lookupmask_ps._8_8_;
  uVar19 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar118 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar75 = vpcmpeqd_avx(auVar118,(undefined1  [16])valid_i->field_0);
    auVar55 = ZEXT816(0) << 0x40;
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar55,5);
    auVar94 = auVar75 & auVar8;
    if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar94[0xf] < '\0')
    {
      auVar8 = vandps_avx(auVar8,auVar75);
      auVar189 = ZEXT1664(auVar8);
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar209._8_4_ = 0x7fffffff;
      auVar209._0_8_ = 0x7fffffff7fffffff;
      auVar209._12_4_ = 0x7fffffff;
      auVar75 = vandps_avx(auVar209,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar194._8_4_ = 0x219392ef;
      auVar194._0_8_ = 0x219392ef219392ef;
      auVar194._12_4_ = 0x219392ef;
      auVar75 = vcmpps_avx(auVar75,auVar194,1);
      auVar94 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar194,auVar75)
      ;
      auVar75 = vandps_avx(auVar209,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar75 = vcmpps_avx(auVar75,auVar194,1);
      auVar133 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar194,auVar75
                              );
      auVar75 = vandps_avx(auVar209,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar75 = vcmpps_avx(auVar75,auVar194,1);
      auVar75 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar194,auVar75)
      ;
      auVar135 = vrcpps_avx(auVar94);
      fVar9 = auVar135._0_4_;
      auVar125._0_4_ = auVar94._0_4_ * fVar9;
      fVar10 = auVar135._4_4_;
      auVar125._4_4_ = auVar94._4_4_ * fVar10;
      fVar73 = auVar135._8_4_;
      auVar125._8_4_ = auVar94._8_4_ * fVar73;
      fVar98 = auVar135._12_4_;
      auVar125._12_4_ = auVar94._12_4_ * fVar98;
      auVar195._8_4_ = 0x3f800000;
      auVar195._0_8_ = 0x3f8000003f800000;
      auVar195._12_4_ = 0x3f800000;
      auVar94 = vsubps_avx(auVar195,auVar125);
      tray.rdir.field_0._0_4_ = fVar9 + fVar9 * auVar94._0_4_;
      tray.rdir.field_0._4_4_ = fVar10 + fVar10 * auVar94._4_4_;
      tray.rdir.field_0._8_4_ = fVar73 + fVar73 * auVar94._8_4_;
      tray.rdir.field_0._12_4_ = fVar98 + fVar98 * auVar94._12_4_;
      auVar94 = vrcpps_avx(auVar133);
      fVar9 = auVar94._0_4_;
      auVar135._0_4_ = auVar133._0_4_ * fVar9;
      fVar10 = auVar94._4_4_;
      auVar135._4_4_ = auVar133._4_4_ * fVar10;
      fVar73 = auVar94._8_4_;
      auVar135._8_4_ = auVar133._8_4_ * fVar73;
      fVar98 = auVar94._12_4_;
      auVar135._12_4_ = auVar133._12_4_ * fVar98;
      auVar94 = vsubps_avx(auVar195,auVar135);
      tray.rdir.field_0._16_4_ = fVar9 + fVar9 * auVar94._0_4_;
      tray.rdir.field_0._20_4_ = fVar10 + fVar10 * auVar94._4_4_;
      tray.rdir.field_0._24_4_ = fVar73 + fVar73 * auVar94._8_4_;
      tray.rdir.field_0._28_4_ = fVar98 + fVar98 * auVar94._12_4_;
      auVar94 = vrcpps_avx(auVar75);
      fVar9 = auVar94._0_4_;
      auVar146._0_4_ = auVar75._0_4_ * fVar9;
      fVar10 = auVar94._4_4_;
      auVar146._4_4_ = auVar75._4_4_ * fVar10;
      fVar73 = auVar94._8_4_;
      auVar146._8_4_ = auVar75._8_4_ * fVar73;
      fVar98 = auVar94._12_4_;
      auVar146._12_4_ = auVar75._12_4_ * fVar98;
      auVar75 = vsubps_avx(auVar195,auVar146);
      tray.rdir.field_0._32_4_ = fVar9 + fVar9 * auVar75._0_4_;
      tray.rdir.field_0._36_4_ = fVar10 + fVar10 * auVar75._4_4_;
      tray.rdir.field_0._40_4_ = fVar73 + fVar73 * auVar75._8_4_;
      tray.rdir.field_0._44_4_ = fVar98 + fVar98 * auVar75._12_4_;
      auVar75 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar55,1);
      auVar134._8_4_ = 0x10;
      auVar134._0_8_ = 0x1000000010;
      auVar134._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar75,auVar134);
      auVar75 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar55,5);
      auVar94._8_4_ = 0x20;
      auVar94._0_8_ = 0x2000000020;
      auVar94._12_4_ = 0x20;
      auVar164._8_4_ = 0x30;
      auVar164._0_8_ = 0x3000000030;
      auVar164._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar164,auVar94,auVar75)
      ;
      auVar75 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar55,5);
      auVar133._8_4_ = 0x40;
      auVar133._0_8_ = 0x4000000040;
      auVar133._12_4_ = 0x40;
      auVar56._8_4_ = 0x50;
      auVar56._0_8_ = 0x5000000050;
      auVar56._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar56,auVar133,auVar75)
      ;
      auVar75 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar55);
      auVar94 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar55);
      auVar55._8_4_ = 0x7f800000;
      auVar55._0_8_ = 0x7f8000007f800000;
      auVar55._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar55,auVar75,auVar8);
      auVar75._8_4_ = 0xff800000;
      auVar75._0_8_ = 0xff800000ff800000;
      auVar75._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar75,auVar94,auVar8);
      terminated.field_0.i[1] = auVar8._4_4_ ^ auVar118._4_4_;
      terminated.field_0.i[0] = auVar8._0_4_ ^ auVar118._0_4_;
      terminated.field_0.i[2] = auVar8._8_4_ ^ auVar118._8_4_;
      terminated.field_0.i[3] = auVar8._12_4_ ^ auVar118._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1b70 = ray + 0x80;
      local_1b78 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar36 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00ecc997:
      do {
        do {
          root.ptr = local_1b78[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ece64d;
          local_1b78 = local_1b78 + -1;
          paVar36 = paVar36 + -1;
          vVar4.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar36->v;
          auVar97 = ZEXT1664((undefined1  [16])vVar4.field_0);
          auVar118 = vcmpps_avx((undefined1  [16])vVar4.field_0,(undefined1  [16])tray.tfar.field_0,
                                1);
          uVar22 = vmovmskps_avx(auVar118);
        } while (uVar22 == 0);
        uVar25 = (ulong)(uVar22 & 0xff);
        uVar22 = POPCOUNT(uVar22 & 0xff);
        if (uVar31 < uVar22) {
LAB_00ecc9db:
          do {
            lVar32 = -0x10;
            uVar22 = (uint)root.ptr;
            auVar118 = auVar97._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ece64d;
              auVar75 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar118,6);
              if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar75[0xf] < '\0') {
                if ((uVar22 & 0xf) == 8) {
                  auVar67 = vpcmpeqd_avx(auVar75,auVar75);
                  auVar67 = auVar67 ^ (undefined1  [16])terminated.field_0;
                  auVar45._0_4_ = (float)((pre.super_Precalculations.grid)->time_steps - 1);
                  auVar45._4_12_ = auVar189._4_12_;
                  auVar118 = vshufps_avx(auVar45,auVar45,0);
                  auVar76._0_4_ = auVar118._0_4_ * *(float *)(ray + 0x70);
                  auVar76._4_4_ = auVar118._4_4_ * *(float *)(ray + 0x74);
                  auVar76._8_4_ = auVar118._8_4_ * *(float *)(ray + 0x78);
                  auVar76._12_4_ = auVar118._12_4_ * *(float *)(ray + 0x7c);
                  auVar118 = vroundps_avx(auVar76,1);
                  auVar75 = vshufps_avx(ZEXT416((uint)(auVar45._0_4_ + -1.0)),
                                        ZEXT416((uint)(auVar45._0_4_ + -1.0)),0);
                  auVar118 = vminps_avx(auVar118,auVar75);
                  auVar118 = vmaxps_avx(auVar118,_DAT_01f45a50);
                  _local_1998 = vsubps_avx(auVar76,auVar118);
                  vitime.field_0 =
                       (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar118);
                  auVar46._8_4_ = 0x3f800000;
                  auVar46._0_8_ = 0x3f8000003f800000;
                  auVar46._12_4_ = 0x3f800000;
                  _local_19a8 = vsubps_avx(auVar46,_local_1998);
                  uVar25 = root.ptr >> 2 & 0xfffffffffffffffc;
                  auVar95 = auVar67;
                  while (uVar22 = vmovmskps_avx(auVar95), uVar22 != 0) {
                    lVar32 = 0;
                    if ((uVar22 & 0xff) != 0) {
                      for (; ((uVar22 & 0xff) >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                      }
                    }
                    uVar42 = (ulong)(pre.super_Precalculations.grid)->dim_offset;
                    uVar37 = (ulong)(pre.super_Precalculations.grid)->width;
                    uVar29 = (ulong)(pre.super_Precalculations.grid)->gridOffset;
                    lVar41 = (ulong)(pre.super_Precalculations.grid)->gridBytes *
                             (long)vitime.field_0.i[(int)lVar32];
                    uVar22 = (pre.super_Precalculations.grid)->height;
                    uVar34 = (ulong)((pre.super_Precalculations.grid)->gridBytes & 0xfffffffc);
                    lVar43 = uVar34 + uVar29 + lVar41;
                    lVar39 = uVar42 * 0xc + lVar43;
                    local_1b68 = (pre.super_Precalculations.grid)->data +
                                 lVar39 + uVar37 * 4 + uVar25 + -0x30;
                    lVar30 = lVar41 + uVar42 * 8 + uVar29;
                    lVar35 = uVar34 + lVar30;
                    local_1b30 = (pre.super_Precalculations.grid)->data +
                                 lVar35 + uVar37 * 4 + uVar25 + -0x30;
                    lVar27 = lVar43 + uVar42 * 4;
                    local_1b38 = (pre.super_Precalculations.grid)->data +
                                 uVar37 * 4 + lVar27 + uVar25 + -0x30;
                    local_1b40 = (pre.super_Precalculations.grid)->data +
                                 lVar43 + uVar37 * 4 + uVar25 + -0x30;
                    lVar18 = uVar25 + 0x30;
                    local_1b48 = (pre.super_Precalculations.grid)->data +
                                 uVar29 + lVar41 + uVar37 * 4 + lVar18 + -0x30;
                    local_1b50 = (pre.super_Precalculations.grid)->data +
                                 lVar30 + uVar37 * 4 + lVar18 + -0x30;
                    lVar26 = lVar41 + uVar42 * 4 + uVar29;
                    local_1b58 = (pre.super_Precalculations.grid)->data +
                                 lVar26 + uVar37 * 4 + lVar18 + -0x30;
                    local_1bf0 = (pre.super_Precalculations.grid)->data + lVar39 + lVar18 + -0x30;
                    pcVar38 = (pre.super_Precalculations.grid)->data + lVar35 + lVar18 + -0x30;
                    local_1ac8 = (pre.super_Precalculations.grid)->data + lVar27 + lVar18 + -0x30;
                    pcVar33 = (pre.super_Precalculations.grid)->data + lVar43 + lVar18 + -0x30;
                    local_1ac0 = (pre.super_Precalculations.grid)->data + lVar30 + lVar18 + -0x30;
                    local_1ad0 = (pre.super_Precalculations.grid)->data + lVar26 + lVar18 + -0x30;
                    pcVar40 = (pre.super_Precalculations.grid)->data + lVar41 + -0x30;
                    auVar118 = vpshufd_avx(ZEXT416((uint)vitime.field_0.i[(int)lVar32]),0);
                    auVar75 = vpcmpeqd_avx(auVar118,(undefined1  [16])vitime.field_0);
                    auVar118 = vpand_avx(auVar75,auVar95);
                    auVar75 = vpcmpeqd_avx(auVar75,auVar75);
                    lVar32 = uVar37 * 4;
                    local_1b60 = uVar29 + 0x2c;
                    auVar97 = ZEXT1664(auVar118);
                    lVar27 = 0;
                    while (lVar27 != (ulong)(uVar22 != 2) + 1) {
                      lVar27 = lVar27 + 1;
                      lVar18 = local_1b60 + uVar25;
                      lVar26 = 0;
                      do {
                        if ((ulong)(uVar37 != 2) * 4 + 4 == lVar26) break;
                        fVar9 = *(float *)(pcVar40 + lVar26 + lVar18);
                        fVar10 = *(float *)(local_1ad0 + lVar26 + -4);
                        fVar73 = *(float *)(local_1ac0 + lVar26 + -4);
                        fVar98 = *(float *)(pcVar40 + lVar26 + lVar18 + 4);
                        fVar44 = *(float *)(local_1ad0 + lVar26);
                        fVar70 = *(float *)(local_1ac0 + lVar26);
                        fVar71 = *(float *)(local_1b48 + lVar26 + -4);
                        fVar72 = *(float *)(local_1b58 + lVar26 + -4);
                        fVar2 = *(float *)(local_1b50 + lVar26 + -4);
                        auVar135 = auVar97._0_16_;
                        fVar193 = *(float *)(pcVar33 + lVar26 + -4);
                        fVar172 = *(float *)(local_1ac8 + lVar26 + -4);
                        fVar175 = *(float *)(pcVar38 + lVar26 + -4);
                        fVar204 = *(float *)(pcVar33 + lVar26);
                        fVar205 = *(float *)(local_1ac8 + lVar26);
                        fVar207 = *(float *)(pcVar38 + lVar26);
                        fVar206 = *(float *)(local_1b40 + lVar26 + 0x2c);
                        local_1c68._4_4_ =
                             fVar193 * (float)local_1998._4_4_ + (float)local_19a8._4_4_ * fVar9;
                        local_1c68._0_4_ =
                             fVar193 * (float)local_1998._0_4_ + (float)local_19a8._0_4_ * fVar9;
                        fStack_1c60 = fVar193 * fStack_1990 + fStack_19a0 * fVar9;
                        fStack_1c5c = fVar193 * fStack_198c + fStack_199c * fVar9;
                        fVar9 = *(float *)(local_1b38 + lVar26 + 0x2c);
                        auVar151._0_4_ =
                             fVar172 * (float)local_1998._0_4_ + (float)local_19a8._0_4_ * fVar10;
                        auVar151._4_4_ =
                             fVar172 * (float)local_1998._4_4_ + (float)local_19a8._4_4_ * fVar10;
                        auVar151._8_4_ = fVar172 * fStack_1990 + fStack_19a0 * fVar10;
                        auVar151._12_4_ = fVar172 * fStack_198c + fStack_199c * fVar10;
                        fVar10 = *(float *)(local_1b30 + lVar26 + 0x2c);
                        auVar129._0_4_ =
                             fVar175 * (float)local_1998._0_4_ + (float)local_19a8._0_4_ * fVar73;
                        auVar129._4_4_ =
                             fVar175 * (float)local_1998._4_4_ + (float)local_19a8._4_4_ * fVar73;
                        auVar129._8_4_ = fVar175 * fStack_1990 + fStack_19a0 * fVar73;
                        auVar129._12_4_ = fVar175 * fStack_198c + fStack_199c * fVar73;
                        local_1b18._4_4_ =
                             (float)local_19a8._4_4_ * fVar98 + fVar204 * (float)local_1998._4_4_;
                        local_1b18._0_4_ =
                             (float)local_19a8._0_4_ * fVar98 + fVar204 * (float)local_1998._0_4_;
                        fStack_1b10 = fStack_19a0 * fVar98 + fVar204 * fStack_1990;
                        fStack_1b0c = fStack_199c * fVar98 + fVar204 * fStack_198c;
                        local_1c08._4_4_ =
                             fVar205 * (float)local_1998._4_4_ + (float)local_19a8._4_4_ * fVar44;
                        local_1c08._0_4_ =
                             fVar205 * (float)local_1998._0_4_ + (float)local_19a8._0_4_ * fVar44;
                        fStack_1c00 = fVar205 * fStack_1990 + fStack_19a0 * fVar44;
                        fStack_1bfc = fVar205 * fStack_198c + fStack_199c * fVar44;
                        local_1ab8._4_4_ =
                             fVar207 * (float)local_1998._4_4_ + (float)local_19a8._4_4_ * fVar70;
                        local_1ab8._0_4_ =
                             fVar207 * (float)local_1998._0_4_ + (float)local_19a8._0_4_ * fVar70;
                        fStack_1ab0 = fVar207 * fStack_1990 + fStack_19a0 * fVar70;
                        fStack_1aac = fVar207 * fStack_198c + fStack_199c * fVar70;
                        auVar218._0_4_ =
                             (float)local_19a8._0_4_ * fVar71 + fVar206 * (float)local_1998._0_4_;
                        auVar218._4_4_ =
                             (float)local_19a8._4_4_ * fVar71 + fVar206 * (float)local_1998._4_4_;
                        auVar218._8_4_ = fStack_19a0 * fVar71 + fVar206 * fStack_1990;
                        auVar218._12_4_ = fStack_199c * fVar71 + fVar206 * fStack_198c;
                        auVar47._0_4_ =
                             (float)local_19a8._0_4_ * fVar72 + fVar9 * (float)local_1998._0_4_;
                        auVar47._4_4_ =
                             (float)local_19a8._4_4_ * fVar72 + fVar9 * (float)local_1998._4_4_;
                        auVar47._8_4_ = fStack_19a0 * fVar72 + fVar9 * fStack_1990;
                        auVar47._12_4_ = fStack_199c * fVar72 + fVar9 * fStack_198c;
                        auVar77._0_4_ =
                             (float)local_19a8._0_4_ * fVar2 + fVar10 * (float)local_1998._0_4_;
                        auVar77._4_4_ =
                             (float)local_19a8._4_4_ * fVar2 + fVar10 * (float)local_1998._4_4_;
                        auVar77._8_4_ = fStack_19a0 * fVar2 + fVar10 * fStack_1990;
                        auVar77._12_4_ = fStack_199c * fVar2 + fVar10 * fStack_198c;
                        auVar94 = *(undefined1 (*) [16])(ray + 0x10);
                        auVar55 = *(undefined1 (*) [16])(ray + 0x20);
                        auVar125 = vsubps_avx(auVar151,auVar94);
                        auVar146 = vsubps_avx(auVar129,auVar55);
                        auVar56 = vsubps_avx(auVar47,auVar94);
                        auVar134 = vsubps_avx(auVar77,auVar55);
                        auVar133 = vsubps_avx(auVar56,auVar125);
                        auVar164 = vsubps_avx(auVar134,auVar146);
                        fVar250 = auVar125._0_4_;
                        fVar177 = fVar250 + auVar56._0_4_;
                        fVar252 = auVar125._4_4_;
                        fVar190 = fVar252 + auVar56._4_4_;
                        fVar255 = auVar125._8_4_;
                        fVar191 = fVar255 + auVar56._8_4_;
                        fVar256 = auVar125._12_4_;
                        fVar192 = fVar256 + auVar56._12_4_;
                        fVar9 = auVar146._0_4_;
                        fVar193 = auVar134._0_4_ + fVar9;
                        fVar10 = auVar146._4_4_;
                        fVar204 = auVar134._4_4_ + fVar10;
                        fVar73 = auVar146._8_4_;
                        fVar206 = auVar134._8_4_ + fVar73;
                        fVar98 = auVar146._12_4_;
                        fVar208 = auVar134._12_4_ + fVar98;
                        fVar44 = auVar164._0_4_;
                        auVar48._0_4_ = fVar177 * fVar44;
                        fVar72 = auVar164._4_4_;
                        auVar48._4_4_ = fVar190 * fVar72;
                        fVar172 = auVar164._8_4_;
                        auVar48._8_4_ = fVar191 * fVar172;
                        fVar205 = auVar164._12_4_;
                        auVar48._12_4_ = fVar192 * fVar205;
                        fVar70 = auVar133._0_4_;
                        auVar210._0_4_ = fVar193 * fVar70;
                        fVar2 = auVar133._4_4_;
                        auVar210._4_4_ = fVar204 * fVar2;
                        fVar175 = auVar133._8_4_;
                        auVar210._8_4_ = fVar206 * fVar175;
                        fVar207 = auVar133._12_4_;
                        auVar210._12_4_ = fVar208 * fVar207;
                        auVar164 = vsubps_avx(auVar210,auVar48);
                        auVar133 = *(undefined1 (*) [16])ray;
                        auVar194 = vsubps_avx(_local_1c68,auVar133);
                        auVar195 = vsubps_avx(auVar218,auVar133);
                        auVar209 = vsubps_avx(auVar195,auVar194);
                        fVar71 = auVar209._0_4_;
                        auVar196._0_4_ = fVar193 * fVar71;
                        fVar193 = auVar209._4_4_;
                        auVar196._4_4_ = fVar204 * fVar193;
                        fVar204 = auVar209._8_4_;
                        auVar196._8_4_ = fVar206 * fVar204;
                        fVar206 = auVar209._12_4_;
                        auVar196._12_4_ = fVar208 * fVar206;
                        fVar170 = auVar194._0_4_;
                        fVar208 = fVar170 + auVar195._0_4_;
                        fVar176 = auVar194._4_4_;
                        fVar223 = fVar176 + auVar195._4_4_;
                        fVar225 = auVar194._8_4_;
                        fVar226 = fVar225 + auVar195._8_4_;
                        fVar214 = auVar194._12_4_;
                        fVar227 = fVar214 + auVar195._12_4_;
                        auVar254._0_4_ = fVar208 * fVar44;
                        auVar254._4_4_ = fVar223 * fVar72;
                        auVar254._8_4_ = fVar226 * fVar172;
                        auVar254._12_4_ = fVar227 * fVar205;
                        auVar209 = vsubps_avx(auVar254,auVar196);
                        auVar197._0_4_ = fVar208 * fVar70;
                        auVar197._4_4_ = fVar223 * fVar2;
                        auVar197._8_4_ = fVar226 * fVar175;
                        auVar197._12_4_ = fVar227 * fVar207;
                        auVar179._0_4_ = fVar71 * fVar177;
                        auVar179._4_4_ = fVar193 * fVar190;
                        auVar179._8_4_ = fVar204 * fVar191;
                        auVar179._12_4_ = fVar206 * fVar192;
                        auVar11 = vsubps_avx(auVar179,auVar197);
                        auVar15 = *(undefined1 (*) [12])(ray + 0x60);
                        fVar177 = *(float *)(ray + 0x6c);
                        auVar16 = *(undefined1 (*) [12])(ray + 0x50);
                        fVar190 = *(float *)(ray + 0x5c);
                        fVar191 = *(float *)(ray + 0x40);
                        fVar192 = *(float *)(ray + 0x44);
                        fVar208 = *(float *)(ray + 0x48);
                        auVar17 = *(undefined1 (*) [12])(ray + 0x40);
                        fVar223 = *(float *)(ray + 0x4c);
                        fVar216 = auVar164._0_4_ * fVar191 +
                                  auVar11._0_4_ * *(float *)(ray + 0x60) +
                                  auVar209._0_4_ * *(float *)(ray + 0x50);
                        fVar224 = auVar164._4_4_ * fVar192 +
                                  auVar11._4_4_ * *(float *)(ray + 100) +
                                  auVar209._4_4_ * *(float *)(ray + 0x54);
                        local_1b28 = CONCAT44(fVar224,fVar216);
                        register0x00001488 =
                             auVar164._8_4_ * fVar208 +
                             auVar11._8_4_ * *(float *)(ray + 0x68) +
                             auVar209._8_4_ * *(float *)(ray + 0x58);
                        register0x0000148c =
                             auVar164._12_4_ * fVar223 +
                             auVar11._12_4_ * fVar177 + auVar209._12_4_ * fVar190;
                        auVar94 = vsubps_avx(_local_1c08,auVar94);
                        auVar55 = vsubps_avx(_local_1ab8,auVar55);
                        auVar125 = vsubps_avx(auVar125,auVar94);
                        auVar146 = vsubps_avx(auVar146,auVar55);
                        fVar226 = fVar250 + auVar94._0_4_;
                        fVar227 = fVar252 + auVar94._4_4_;
                        fVar171 = fVar255 + auVar94._8_4_;
                        fVar174 = fVar256 + auVar94._12_4_;
                        fVar228 = fVar9 + auVar55._0_4_;
                        fVar231 = fVar10 + auVar55._4_4_;
                        fVar232 = fVar73 + auVar55._8_4_;
                        fVar233 = fVar98 + auVar55._12_4_;
                        fVar246 = auVar146._0_4_;
                        auVar260._0_4_ = fVar246 * fVar226;
                        fVar247 = auVar146._4_4_;
                        auVar260._4_4_ = fVar247 * fVar227;
                        fVar248 = auVar146._8_4_;
                        auVar260._8_4_ = fVar248 * fVar171;
                        fVar249 = auVar146._12_4_;
                        auVar260._12_4_ = fVar249 * fVar174;
                        fVar234 = auVar125._0_4_;
                        auVar180._0_4_ = fVar234 * fVar228;
                        fVar237 = auVar125._4_4_;
                        auVar180._4_4_ = fVar237 * fVar231;
                        fVar238 = auVar125._8_4_;
                        auVar180._8_4_ = fVar238 * fVar232;
                        fVar239 = auVar125._12_4_;
                        auVar180._12_4_ = fVar239 * fVar233;
                        auVar125 = vsubps_avx(auVar180,auVar260);
                        auVar133 = vsubps_avx(_local_1b18,auVar133);
                        auVar146 = vsubps_avx(auVar194,auVar133);
                        fVar240 = auVar146._0_4_;
                        auVar229._0_4_ = fVar240 * fVar228;
                        fVar241 = auVar146._4_4_;
                        auVar229._4_4_ = fVar241 * fVar231;
                        fVar242 = auVar146._8_4_;
                        auVar229._8_4_ = fVar242 * fVar232;
                        fVar243 = auVar146._12_4_;
                        auVar229._12_4_ = fVar243 * fVar233;
                        fVar228 = auVar133._0_4_ + fVar170;
                        fVar231 = auVar133._4_4_ + fVar176;
                        fVar232 = auVar133._8_4_ + fVar225;
                        fVar233 = auVar133._12_4_ + fVar214;
                        auVar198._0_4_ = fVar228 * fVar246;
                        auVar198._4_4_ = fVar231 * fVar247;
                        auVar198._8_4_ = fVar232 * fVar248;
                        auVar198._12_4_ = fVar233 * fVar249;
                        auVar146 = vsubps_avx(auVar198,auVar229);
                        auVar230._0_4_ = fVar228 * fVar234;
                        auVar230._4_4_ = fVar231 * fVar237;
                        auVar230._8_4_ = fVar232 * fVar238;
                        auVar230._12_4_ = fVar233 * fVar239;
                        auVar166._0_4_ = fVar240 * fVar226;
                        auVar166._4_4_ = fVar241 * fVar227;
                        auVar166._8_4_ = fVar242 * fVar171;
                        auVar166._12_4_ = fVar243 * fVar174;
                        auVar164 = vsubps_avx(auVar166,auVar230);
                        local_1c68._0_4_ = auVar15._0_4_;
                        local_1c68._4_4_ = auVar15._4_4_;
                        fStack_1c60 = auVar15._8_4_;
                        local_1c78 = auVar16._0_4_;
                        fStack_1c74 = auVar16._4_4_;
                        fStack_1c70 = auVar16._8_4_;
                        local_1b98._0_4_ =
                             fVar191 * auVar125._0_4_ +
                             local_1c78 * auVar146._0_4_ + auVar164._0_4_ * (float)local_1c68._0_4_;
                        local_1b98._4_4_ =
                             fVar192 * auVar125._4_4_ +
                             fStack_1c74 * auVar146._4_4_ + auVar164._4_4_ * (float)local_1c68._4_4_
                        ;
                        fStack_1b90 = fVar208 * auVar125._8_4_ +
                                      fStack_1c70 * auVar146._8_4_ + auVar164._8_4_ * fStack_1c60;
                        fStack_1b8c = fVar223 * auVar125._12_4_ +
                                      fVar190 * auVar146._12_4_ + auVar164._12_4_ * fVar177;
                        auVar125 = vsubps_avx(auVar133,auVar195);
                        fVar226 = auVar133._0_4_ + auVar195._0_4_;
                        fVar227 = auVar133._4_4_ + auVar195._4_4_;
                        fVar171 = auVar133._8_4_ + auVar195._8_4_;
                        fVar174 = auVar133._12_4_ + auVar195._12_4_;
                        auVar133 = vsubps_avx(auVar94,auVar56);
                        fVar228 = auVar94._0_4_ + auVar56._0_4_;
                        fVar231 = auVar94._4_4_ + auVar56._4_4_;
                        fVar232 = auVar94._8_4_ + auVar56._8_4_;
                        fVar233 = auVar94._12_4_ + auVar56._12_4_;
                        auVar94 = vsubps_avx(auVar55,auVar134);
                        fVar99 = auVar55._0_4_ + auVar134._0_4_;
                        fVar119 = auVar55._4_4_ + auVar134._4_4_;
                        fVar121 = auVar55._8_4_ + auVar134._8_4_;
                        fVar123 = auVar55._12_4_ + auVar134._12_4_;
                        fVar173 = auVar94._0_4_;
                        auVar152._0_4_ = fVar173 * fVar228;
                        fVar217 = auVar94._4_4_;
                        auVar152._4_4_ = fVar217 * fVar231;
                        fVar213 = auVar94._8_4_;
                        auVar152._8_4_ = fVar213 * fVar232;
                        fVar215 = auVar94._12_4_;
                        auVar152._12_4_ = fVar215 * fVar233;
                        fVar120 = auVar133._0_4_;
                        auVar181._0_4_ = fVar120 * fVar99;
                        fVar122 = auVar133._4_4_;
                        auVar181._4_4_ = fVar122 * fVar119;
                        fVar124 = auVar133._8_4_;
                        auVar181._8_4_ = fVar124 * fVar121;
                        fVar163 = auVar133._12_4_;
                        auVar181._12_4_ = fVar163 * fVar123;
                        auVar94 = vsubps_avx(auVar181,auVar152);
                        fVar251 = auVar125._0_4_;
                        auVar101._0_4_ = fVar251 * fVar99;
                        fVar99 = auVar125._4_4_;
                        auVar101._4_4_ = fVar99 * fVar119;
                        fVar119 = auVar125._8_4_;
                        auVar101._8_4_ = fVar119 * fVar121;
                        fVar121 = auVar125._12_4_;
                        auVar101._12_4_ = fVar121 * fVar123;
                        auVar182._0_4_ = fVar173 * fVar226;
                        auVar182._4_4_ = fVar217 * fVar227;
                        auVar182._8_4_ = fVar213 * fVar171;
                        auVar182._12_4_ = fVar215 * fVar174;
                        auVar55 = vsubps_avx(auVar182,auVar101);
                        auVar183._8_4_ = 0x7fffffff;
                        auVar183._0_8_ = 0x7fffffff7fffffff;
                        auVar183._12_4_ = 0x7fffffff;
                        auVar49._0_4_ = fVar226 * fVar120;
                        auVar49._4_4_ = fVar227 * fVar122;
                        auVar49._8_4_ = fVar171 * fVar124;
                        auVar49._12_4_ = fVar174 * fVar163;
                        auVar78._0_4_ = fVar251 * fVar228;
                        auVar78._4_4_ = fVar99 * fVar231;
                        auVar78._8_4_ = fVar119 * fVar232;
                        auVar78._12_4_ = fVar121 * fVar233;
                        auVar133 = vsubps_avx(auVar78,auVar49);
                        auVar50._0_4_ =
                             fVar191 * auVar94._0_4_ +
                             auVar133._0_4_ * (float)local_1c68._0_4_ + local_1c78 * auVar55._0_4_;
                        auVar50._4_4_ =
                             fVar192 * auVar94._4_4_ +
                             auVar133._4_4_ * (float)local_1c68._4_4_ + fStack_1c74 * auVar55._4_4_;
                        auVar50._8_4_ =
                             fVar208 * auVar94._8_4_ +
                             auVar133._8_4_ * fStack_1c60 + fStack_1c70 * auVar55._8_4_;
                        auVar50._12_4_ =
                             fVar223 * auVar94._12_4_ +
                             auVar133._12_4_ * fVar177 + fVar190 * auVar55._12_4_;
                        auVar139._0_8_ =
                             CONCAT44(auVar50._4_4_ + fVar224 + (float)local_1b98._4_4_,
                                      auVar50._0_4_ + fVar216 + (float)local_1b98._0_4_);
                        auVar139._8_4_ = auVar50._8_4_ + register0x00001488 + fStack_1b90;
                        auVar139._12_4_ = auVar50._12_4_ + register0x0000148c + fStack_1b8c;
                        auVar94 = vandps_avx(auVar139,auVar183);
                        auVar79._0_4_ = auVar94._0_4_ * 1.1920929e-07;
                        auVar79._4_4_ = auVar94._4_4_ * 1.1920929e-07;
                        auVar79._8_4_ = auVar94._8_4_ * 1.1920929e-07;
                        auVar79._12_4_ = auVar94._12_4_ * 1.1920929e-07;
                        auVar94 = vminps_avx(_local_1b28,_local_1b98);
                        auVar94 = vminps_avx(auVar94,auVar50);
                        uVar29 = CONCAT44(auVar79._4_4_,auVar79._0_4_);
                        auVar153._0_8_ = uVar29 ^ 0x8000000080000000;
                        auVar153._8_4_ = -auVar79._8_4_;
                        auVar153._12_4_ = -auVar79._12_4_;
                        auVar94 = vcmpps_avx(auVar94,auVar153,5);
                        auVar55 = vmaxps_avx(_local_1b28,_local_1b98);
                        auVar55 = vmaxps_avx(auVar55,auVar50);
                        auVar55 = vcmpps_avx(auVar55,auVar79,2);
                        auVar94 = vorps_avx(auVar94,auVar55);
                        auVar55 = auVar135 & auVar94;
                        auVar94 = vandps_avx(auVar135,auVar94);
                        if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar55[0xf] < '\0') {
                          auVar51._0_4_ = fVar234 * fVar44;
                          auVar51._4_4_ = fVar237 * fVar72;
                          auVar51._8_4_ = fVar238 * fVar172;
                          auVar51._12_4_ = fVar239 * fVar205;
                          auVar80._0_4_ = fVar70 * fVar246;
                          auVar80._4_4_ = fVar2 * fVar247;
                          auVar80._8_4_ = fVar175 * fVar248;
                          auVar80._12_4_ = fVar207 * fVar249;
                          auVar125 = vsubps_avx(auVar80,auVar51);
                          auVar102._0_4_ = fVar246 * fVar120;
                          auVar102._4_4_ = fVar247 * fVar122;
                          auVar102._8_4_ = fVar248 * fVar124;
                          auVar102._12_4_ = fVar249 * fVar163;
                          auVar154._0_4_ = fVar234 * fVar173;
                          auVar154._4_4_ = fVar237 * fVar217;
                          auVar154._8_4_ = fVar238 * fVar213;
                          auVar154._12_4_ = fVar239 * fVar215;
                          auVar146 = vsubps_avx(auVar154,auVar102);
                          auVar55 = vandps_avx(auVar51,auVar183);
                          auVar133 = vandps_avx(auVar102,auVar183);
                          auVar55 = vcmpps_avx(auVar55,auVar133,1);
                          auVar125 = vblendvps_avx(auVar146,auVar125,auVar55);
                          auVar52._0_4_ = fVar240 * fVar173;
                          auVar52._4_4_ = fVar241 * fVar217;
                          auVar52._8_4_ = fVar242 * fVar213;
                          auVar52._12_4_ = fVar243 * fVar215;
                          auVar81._0_4_ = fVar240 * fVar44;
                          auVar81._4_4_ = fVar241 * fVar72;
                          auVar81._8_4_ = fVar242 * fVar172;
                          auVar81._12_4_ = fVar243 * fVar205;
                          auVar140._0_4_ = fVar71 * fVar246;
                          auVar140._4_4_ = fVar193 * fVar247;
                          auVar140._8_4_ = fVar204 * fVar248;
                          auVar140._12_4_ = fVar206 * fVar249;
                          auVar146 = vsubps_avx(auVar81,auVar140);
                          auVar155._0_4_ = fVar251 * fVar246;
                          auVar155._4_4_ = fVar99 * fVar247;
                          auVar155._8_4_ = fVar119 * fVar248;
                          auVar155._12_4_ = fVar121 * fVar249;
                          auVar56 = vsubps_avx(auVar155,auVar52);
                          auVar55 = vandps_avx(auVar140,auVar183);
                          auVar133 = vandps_avx(auVar52,auVar183);
                          auVar55 = vcmpps_avx(auVar55,auVar133,1);
                          auVar146 = vblendvps_avx(auVar56,auVar146,auVar55);
                          auVar53._0_4_ = fVar251 * fVar234;
                          auVar53._4_4_ = fVar99 * fVar237;
                          auVar53._8_4_ = fVar119 * fVar238;
                          auVar53._12_4_ = fVar121 * fVar239;
                          auVar82._0_4_ = fVar71 * fVar234;
                          auVar82._4_4_ = fVar193 * fVar237;
                          auVar82._8_4_ = fVar204 * fVar238;
                          auVar82._12_4_ = fVar206 * fVar239;
                          auVar156._0_4_ = fVar240 * fVar70;
                          auVar156._4_4_ = fVar241 * fVar2;
                          auVar156._8_4_ = fVar242 * fVar175;
                          auVar156._12_4_ = fVar243 * fVar207;
                          auVar184._0_4_ = fVar240 * fVar120;
                          auVar184._4_4_ = fVar241 * fVar122;
                          auVar184._8_4_ = fVar242 * fVar124;
                          auVar184._12_4_ = fVar243 * fVar163;
                          auVar56 = vsubps_avx(auVar82,auVar156);
                          auVar134 = vsubps_avx(auVar184,auVar53);
                          auVar55 = vandps_avx(auVar183,auVar156);
                          auVar133 = vandps_avx(auVar183,auVar53);
                          auVar55 = vcmpps_avx(auVar55,auVar133,1);
                          auVar133 = vblendvps_avx(auVar134,auVar56,auVar55);
                          local_1c58 = auVar17._0_4_;
                          fStack_1c54 = auVar17._4_4_;
                          fStack_1c50 = auVar17._8_4_;
                          fVar44 = auVar125._0_4_ * local_1c58 +
                                   auVar133._0_4_ * (float)local_1c68._0_4_ +
                                   auVar146._0_4_ * local_1c78;
                          fVar70 = auVar125._4_4_ * fStack_1c54 +
                                   auVar133._4_4_ * (float)local_1c68._4_4_ +
                                   auVar146._4_4_ * fStack_1c74;
                          fVar71 = auVar125._8_4_ * fStack_1c50 +
                                   auVar133._8_4_ * fStack_1c60 + auVar146._8_4_ * fStack_1c70;
                          fVar72 = auVar125._12_4_ * fVar223 +
                                   auVar133._12_4_ * fVar177 + auVar146._12_4_ * fVar190;
                          auVar54._0_4_ = fVar44 + fVar44;
                          auVar54._4_4_ = fVar70 + fVar70;
                          auVar54._8_4_ = fVar71 + fVar71;
                          auVar54._12_4_ = fVar72 + fVar72;
                          fVar44 = auVar125._0_4_ * fVar170 +
                                   auVar133._0_4_ * fVar9 + auVar146._0_4_ * fVar250;
                          fVar70 = auVar125._4_4_ * fVar176 +
                                   auVar133._4_4_ * fVar10 + auVar146._4_4_ * fVar252;
                          fVar71 = auVar125._8_4_ * fVar225 +
                                   auVar133._8_4_ * fVar73 + auVar146._8_4_ * fVar255;
                          fVar72 = auVar125._12_4_ * fVar214 +
                                   auVar133._12_4_ * fVar98 + auVar146._12_4_ * fVar256;
                          auVar55 = vrcpps_avx(auVar54);
                          fVar9 = auVar55._0_4_;
                          auVar185._0_4_ = auVar54._0_4_ * fVar9;
                          fVar10 = auVar55._4_4_;
                          auVar185._4_4_ = auVar54._4_4_ * fVar10;
                          fVar73 = auVar55._8_4_;
                          auVar185._8_4_ = auVar54._8_4_ * fVar73;
                          fVar98 = auVar55._12_4_;
                          auVar185._12_4_ = auVar54._12_4_ * fVar98;
                          auVar199._8_4_ = 0x3f800000;
                          auVar199._0_8_ = 0x3f8000003f800000;
                          auVar199._12_4_ = 0x3f800000;
                          auVar55 = vsubps_avx(auVar199,auVar185);
                          auVar83._0_4_ = (fVar44 + fVar44) * (fVar9 + fVar9 * auVar55._0_4_);
                          auVar83._4_4_ = (fVar70 + fVar70) * (fVar10 + fVar10 * auVar55._4_4_);
                          auVar83._8_4_ = (fVar71 + fVar71) * (fVar73 + fVar73 * auVar55._8_4_);
                          auVar83._12_4_ = (fVar72 + fVar72) * (fVar98 + fVar98 * auVar55._12_4_);
                          auVar55 = vcmpps_avx(auVar83,*(undefined1 (*) [16])(ray + 0x80),2);
                          auVar56 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar83,2);
                          auVar55 = vandps_avx(auVar56,auVar55);
                          auVar56 = vcmpps_avx(auVar54,_DAT_01f45a50,4);
                          auVar55 = vandps_avx(auVar56,auVar55);
                          auVar55 = vpslld_avx(auVar55,0x1f);
                          auVar56 = vpsrad_avx(auVar55,0x1f);
                          auVar55 = auVar94 & auVar56;
                          auVar94 = vandps_avx(auVar56,auVar94);
                          if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar55 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar55[0xf] < '\0') {
                            uStack_1760 = uStack_1b20;
                            _local_1778 = _local_1b98;
                            uStack_1720 = auVar139._8_8_;
                            uStack_1780 = uStack_1720;
                            local_17c8 = auVar133;
                            local_17b8 = auVar146;
                            local_17a8 = auVar125;
                            local_1798 = auVar83;
                            local_1788 = auVar139._0_8_;
                            local_1768 = local_1b28;
                          }
                        }
                        fVar9 = *(float *)(local_1b48 + lVar26);
                        fVar10 = *(float *)(local_1b58 + lVar26);
                        fVar73 = *(float *)(local_1b50 + lVar26);
                        fVar98 = *(float *)(local_1b40 + lVar26 + 0x30);
                        fVar44 = *(float *)(local_1b38 + lVar26 + 0x30);
                        fVar70 = *(float *)(local_1b30 + lVar26 + 0x30);
                        uVar5 = (pre.super_Precalculations.grid)->_geomID;
                        pGVar6 = (context->scene->geometries).items[uVar5].ptr;
                        uVar3 = pGVar6->mask;
                        auVar84._4_4_ = uVar3;
                        auVar84._0_4_ = uVar3;
                        auVar84._8_4_ = uVar3;
                        auVar84._12_4_ = uVar3;
                        auVar55 = vandps_avx(auVar84,*(undefined1 (*) [16])(ray + 0x90));
                        auVar55 = vpcmpeqd_avx(auVar55,_DAT_01f45a50);
                        auVar133 = auVar94 & ~auVar55;
                        if ((((auVar133 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar133 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar133 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar133[0xf] < '\0') {
                          auVar94 = vandnps_avx(auVar55,auVar94);
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar14._8_8_ = uStack_1780;
                            auVar14._0_8_ = local_1788;
                            auVar63._8_4_ = 0x7fffffff;
                            auVar63._0_8_ = 0x7fffffff7fffffff;
                            auVar63._12_4_ = 0x7fffffff;
                            auVar55 = vandps_avx(auVar14,auVar63);
                            auVar133 = vrcpps_avx(auVar14);
                            fVar71 = auVar133._0_4_;
                            auVar109._0_4_ = (float)local_1788 * fVar71;
                            fVar72 = auVar133._4_4_;
                            auVar109._4_4_ = (float)((ulong)local_1788 >> 0x20) * fVar72;
                            fVar2 = auVar133._8_4_;
                            auVar109._8_4_ = (float)uStack_1780 * fVar2;
                            fVar193 = auVar133._12_4_;
                            auVar109._12_4_ = (float)((ulong)uStack_1780 >> 0x20) * fVar193;
                            auVar161._8_4_ = 0x3f800000;
                            auVar161._0_8_ = 0x3f8000003f800000;
                            auVar161._12_4_ = 0x3f800000;
                            auVar133 = vsubps_avx(auVar161,auVar109);
                            auVar90._0_4_ = fVar71 + fVar71 * auVar133._0_4_;
                            auVar90._4_4_ = fVar72 + fVar72 * auVar133._4_4_;
                            auVar90._8_4_ = fVar2 + fVar2 * auVar133._8_4_;
                            auVar90._12_4_ = fVar193 + fVar193 * auVar133._12_4_;
                            auVar110._8_4_ = 0x219392ef;
                            auVar110._0_8_ = 0x219392ef219392ef;
                            auVar110._12_4_ = 0x219392ef;
                            auVar55 = vcmpps_avx(auVar55,auVar110,5);
                            auVar55 = vandps_avx(auVar55,auVar90);
                            auVar64._0_4_ = auVar55._0_4_ * (float)local_1768;
                            auVar64._4_4_ = auVar55._4_4_ * local_1768._4_4_;
                            auVar64._8_4_ = auVar55._8_4_ * (float)uStack_1760;
                            auVar64._12_4_ = auVar55._12_4_ * uStack_1760._4_4_;
                            auVar164 = vminps_avx(auVar64,auVar161);
                            auVar91._0_4_ = auVar55._0_4_ * (float)local_1778._0_4_;
                            auVar91._4_4_ = auVar55._4_4_ * (float)local_1778._4_4_;
                            auVar91._8_4_ = auVar55._8_4_ * fStack_1770;
                            auVar91._12_4_ = auVar55._12_4_ * fStack_176c;
                            auVar194 = vminps_avx(auVar91,auVar161);
                            uVar23 = *(undefined4 *)(local_1bf0 + lVar26 + -4);
                            auVar111._4_4_ = uVar23;
                            auVar111._0_4_ = uVar23;
                            auVar111._8_4_ = uVar23;
                            auVar111._12_4_ = uVar23;
                            auVar133 = vpsrld_avx(auVar111,0x10);
                            auVar56 = ZEXT416(0) << 0x20;
                            auVar55 = vpblendw_avx(auVar111,auVar56,0xaa);
                            auVar55 = vcvtdq2ps_avx(auVar55);
                            auVar133 = vcvtdq2ps_avx(auVar133);
                            local_1b28._0_4_ = (pre.super_Precalculations.grid)->_primID;
                            uVar23 = *(undefined4 *)(local_1b68 + lVar26 + 0x2c);
                            auVar143._4_4_ = uVar23;
                            auVar143._0_4_ = uVar23;
                            auVar143._8_4_ = uVar23;
                            auVar143._12_4_ = uVar23;
                            auVar125 = vsubps_avx(auVar161,auVar164);
                            auVar195 = vsubps_avx(auVar125,auVar194);
                            auVar125 = vpblendw_avx(auVar143,auVar56,0xaa);
                            auVar125 = vcvtdq2ps_avx(auVar125);
                            auVar146 = vpsrld_avx(auVar143,0x10);
                            auVar146 = vcvtdq2ps_avx(auVar146);
                            uVar23 = *(undefined4 *)(local_1bf0 + lVar26);
                            auVar144._4_4_ = uVar23;
                            auVar144._0_4_ = uVar23;
                            auVar144._8_4_ = uVar23;
                            auVar144._12_4_ = uVar23;
                            auVar56 = vpblendw_avx(auVar144,auVar56,0xaa);
                            auVar56 = vcvtdq2ps_avx(auVar56);
                            auVar134 = vpsrld_avx(auVar144,0x10);
                            auVar134 = vcvtdq2ps_avx(auVar134);
                            local_1a38._0_8_ = local_17a8._0_8_;
                            local_1a38._8_8_ = local_17a8._8_8_;
                            local_1a38._16_8_ = local_17b8._0_8_;
                            local_1a38._24_8_ = local_17b8._8_8_;
                            local_1a38._32_8_ = local_17c8._0_8_;
                            local_1a38._40_8_ = local_17c8._8_8_;
                            local_1a08 = local_1798._0_8_;
                            uStack_1a00 = local_1798._8_8_;
                            local_19f8._4_4_ =
                                 auVar164._4_4_ * auVar134._4_4_ * 0.00012207031 +
                                 auVar195._4_4_ * auVar133._4_4_ * 0.00012207031 +
                                 auVar194._4_4_ * auVar146._4_4_ * 0.00012207031;
                            local_19f8._0_4_ =
                                 auVar164._0_4_ * auVar134._0_4_ * 0.00012207031 +
                                 auVar195._0_4_ * auVar133._0_4_ * 0.00012207031 +
                                 auVar194._0_4_ * auVar146._0_4_ * 0.00012207031;
                            fStack_19f0 = auVar164._8_4_ * auVar134._8_4_ * 0.00012207031 +
                                          auVar195._8_4_ * auVar133._8_4_ * 0.00012207031 +
                                          auVar194._8_4_ * auVar146._8_4_ * 0.00012207031;
                            fStack_19ec = auVar164._12_4_ * auVar134._12_4_ * 0.00012207031 +
                                          auVar195._12_4_ * auVar133._12_4_ * 0.00012207031 +
                                          auVar194._12_4_ * auVar146._12_4_ * 0.00012207031;
                            local_19e8._4_4_ =
                                 auVar164._4_4_ * auVar56._4_4_ * 0.00012207031 +
                                 auVar195._4_4_ * auVar55._4_4_ * 0.00012207031 +
                                 auVar194._4_4_ * auVar125._4_4_ * 0.00012207031;
                            local_19e8._0_4_ =
                                 auVar164._0_4_ * auVar56._0_4_ * 0.00012207031 +
                                 auVar195._0_4_ * auVar55._0_4_ * 0.00012207031 +
                                 auVar194._0_4_ * auVar125._0_4_ * 0.00012207031;
                            fStack_19e0 = auVar164._8_4_ * auVar56._8_4_ * 0.00012207031 +
                                          auVar195._8_4_ * auVar55._8_4_ * 0.00012207031 +
                                          auVar194._8_4_ * auVar125._8_4_ * 0.00012207031;
                            fStack_19dc = auVar164._12_4_ * auVar56._12_4_ * 0.00012207031 +
                                          auVar195._12_4_ * auVar55._12_4_ * 0.00012207031 +
                                          auVar194._12_4_ * auVar125._12_4_ * 0.00012207031;
                            args.valid = (int *)&Ng;
                            args.geometryUserPtr = &t;
                            args.context = (RTCRayQueryContext *)&v;
                            args.ray = (RTCRayN *)&u;
                            std::
                            _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                            ::
                            _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                      ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                        *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                 *)&local_1a38.field_0);
                            local_19d8 = vpshufd_avx(ZEXT416(uVar5),0);
                            _local_19e8 = vshufps_avx(ZEXT416((uint)local_1b28._0_4_),
                                                      ZEXT416((uint)local_1b28._0_4_),0);
                            local_1a38._0_8_ = Ng.field_0._0_8_;
                            local_1a38._8_8_ = Ng.field_0._8_8_;
                            local_1a38._16_8_ = Ng.field_0._16_8_;
                            local_1a38._24_8_ = Ng.field_0._24_8_;
                            local_1a38._32_8_ = Ng.field_0._32_8_;
                            local_1a38._40_8_ = Ng.field_0._40_8_;
                            local_1a08 = u.field_0._0_8_;
                            uStack_1a00 = u.field_0._8_8_;
                            _local_19f8 = v.field_0;
                            vcmpps_avx(ZEXT1632(local_19d8),ZEXT1632(local_19d8),0xf);
                            uStack_19c4 = context->user->instID[0];
                            local_19c8 = uStack_19c4;
                            uStack_19c0 = uStack_19c4;
                            uStack_19bc = uStack_19c4;
                            uStack_19b8 = context->user->instPrimID[0];
                            uStack_19b4 = uStack_19b8;
                            uStack_19b0 = uStack_19b8;
                            uStack_19ac = uStack_19b8;
                            _local_1b28 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar55 = vblendvps_avx(_local_1b28,(undefined1  [16])t.field_0,auVar94)
                            ;
                            *(undefined1 (*) [16])(ray + 0x80) = auVar55;
                            args.valid = (int *)local_1b88;
                            args.geometryUserPtr = pGVar6->userPtr;
                            args.context = context->user;
                            args.hit = (RTCHitN *)&local_1a38;
                            args.N = 4;
                            args.ray = (RTCRayN *)ray;
                            local_1b88 = auVar94;
                            if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar189._0_8_ = (*pGVar6->occlusionFilterN)(&args);
                              auVar189._8_56_ = extraout_var;
                              auVar55 = auVar189._0_16_;
                            }
                            if (local_1b88 == (undefined1  [16])0x0) {
                              auVar94 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                              auVar94 = auVar94 ^ _DAT_01f46b70;
                            }
                            else {
                              p_Var7 = context->args->filter;
                              if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar97._0_8_ = (*p_Var7)(&args);
                                auVar97._8_56_ = extraout_var_00;
                                auVar55 = auVar97._0_16_;
                              }
                              auVar133 = vpcmpeqd_avx(local_1b88,_DAT_01f45a50);
                              auVar94 = vpcmpeqd_avx(auVar55,auVar55);
                              auVar94 = auVar133 ^ auVar94;
                              auVar115._8_4_ = 0xff800000;
                              auVar115._0_8_ = 0xff800000ff800000;
                              auVar115._12_4_ = 0xff800000;
                              auVar55 = vblendvps_avx(auVar115,*(undefined1 (*) [16])
                                                                (args.ray + 0x80),auVar133);
                              *(undefined1 (*) [16])(args.ray + 0x80) = auVar55;
                            }
                            auVar55 = vpslld_avx(auVar94,0x1f);
                            auVar94 = vpsrad_avx(auVar55,0x1f);
                            auVar55 = vblendvps_avx(_local_1b28,*(undefined1 (*) [16])local_1b70,
                                                    auVar55);
                            *(undefined1 (*) [16])local_1b70 = auVar55;
                          }
                          auVar135 = vpandn_avx(auVar94,auVar135);
                        }
                        auVar189 = ZEXT1664(CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,fVar44)
                                                                     )));
                        auVar97 = ZEXT1664(auVar135);
                        if ((((auVar135 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar135 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar135 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            -1 < auVar135[0xf]) break;
                        auVar219._0_4_ =
                             (float)local_19a8._0_4_ * fVar9 + (float)local_1998._0_4_ * fVar98;
                        auVar219._4_4_ =
                             (float)local_19a8._4_4_ * fVar9 + (float)local_1998._4_4_ * fVar98;
                        auVar219._8_4_ = fStack_19a0 * fVar9 + fStack_1990 * fVar98;
                        auVar219._12_4_ = fStack_199c * fVar9 + fStack_198c * fVar98;
                        auVar157._0_4_ =
                             (float)local_19a8._0_4_ * fVar10 + (float)local_1998._0_4_ * fVar44;
                        auVar157._4_4_ =
                             (float)local_19a8._4_4_ * fVar10 + (float)local_1998._4_4_ * fVar44;
                        auVar157._8_4_ = fStack_19a0 * fVar10 + fStack_1990 * fVar44;
                        auVar157._12_4_ = fStack_199c * fVar10 + fStack_198c * fVar44;
                        auVar167._0_4_ =
                             (float)local_19a8._0_4_ * fVar73 + fVar70 * (float)local_1998._0_4_;
                        auVar167._4_4_ =
                             (float)local_19a8._4_4_ * fVar73 + fVar70 * (float)local_1998._4_4_;
                        auVar167._8_4_ = fStack_19a0 * fVar73 + fVar70 * fStack_1990;
                        auVar167._12_4_ = fStack_199c * fVar73 + fVar70 * fStack_198c;
                        auVar94 = *(undefined1 (*) [16])ray;
                        auVar55 = *(undefined1 (*) [16])(ray + 0x10);
                        auVar133 = *(undefined1 (*) [16])(ray + 0x20);
                        auVar125 = vsubps_avx(auVar218,auVar94);
                        auVar146 = vsubps_avx(auVar47,auVar55);
                        auVar56 = vsubps_avx(auVar77,auVar133);
                        auVar134 = vsubps_avx(_local_1b18,auVar94);
                        auVar164 = vsubps_avx(_local_1c08,auVar55);
                        auVar194 = vsubps_avx(_local_1ab8,auVar133);
                        auVar195 = vsubps_avx(auVar219,auVar94);
                        auVar55 = vsubps_avx(auVar157,auVar55);
                        auVar133 = vsubps_avx(auVar167,auVar133);
                        auVar94 = vsubps_avx(auVar195,auVar125);
                        auVar209 = vsubps_avx(auVar55,auVar146);
                        auVar11 = vsubps_avx(auVar133,auVar56);
                        fVar242 = auVar146._0_4_;
                        fVar71 = fVar242 + auVar55._0_4_;
                        fVar246 = auVar146._4_4_;
                        fVar72 = fVar246 + auVar55._4_4_;
                        fVar248 = auVar146._8_4_;
                        fVar172 = fVar248 + auVar55._8_4_;
                        fVar250 = auVar146._12_4_;
                        fVar175 = fVar250 + auVar55._12_4_;
                        fVar258 = auVar56._0_4_;
                        fVar193 = fVar258 + auVar133._0_4_;
                        fVar262 = auVar56._4_4_;
                        fVar205 = fVar262 + auVar133._4_4_;
                        fVar263 = auVar56._8_4_;
                        fVar207 = fVar263 + auVar133._8_4_;
                        fVar264 = auVar56._12_4_;
                        fVar206 = fVar264 + auVar133._12_4_;
                        fVar252 = auVar11._0_4_;
                        auVar211._0_4_ = fVar252 * fVar71;
                        fVar255 = auVar11._4_4_;
                        auVar211._4_4_ = fVar255 * fVar72;
                        fVar256 = auVar11._8_4_;
                        auVar211._8_4_ = fVar256 * fVar172;
                        fVar257 = auVar11._12_4_;
                        auVar211._12_4_ = fVar257 * fVar175;
                        fVar44 = auVar209._0_4_;
                        auVar220._0_4_ = fVar193 * fVar44;
                        fVar2 = auVar209._4_4_;
                        auVar220._4_4_ = fVar205 * fVar2;
                        fVar204 = auVar209._8_4_;
                        auVar220._8_4_ = fVar207 * fVar204;
                        fVar177 = auVar209._12_4_;
                        auVar220._12_4_ = fVar206 * fVar177;
                        auVar209 = vsubps_avx(auVar220,auVar211);
                        fVar9 = auVar125._0_4_;
                        fVar191 = auVar195._0_4_ + fVar9;
                        fVar10 = auVar125._4_4_;
                        fVar192 = auVar195._4_4_ + fVar10;
                        fVar73 = auVar125._8_4_;
                        fVar208 = auVar195._8_4_ + fVar73;
                        fVar98 = auVar125._12_4_;
                        fVar223 = auVar195._12_4_ + fVar98;
                        fVar70 = auVar94._0_4_;
                        auVar200._0_4_ = fVar193 * fVar70;
                        fVar193 = auVar94._4_4_;
                        auVar200._4_4_ = fVar205 * fVar193;
                        fVar205 = auVar94._8_4_;
                        auVar200._8_4_ = fVar207 * fVar205;
                        fVar190 = auVar94._12_4_;
                        auVar200._12_4_ = fVar206 * fVar190;
                        auVar221._0_4_ = fVar191 * fVar252;
                        auVar221._4_4_ = fVar192 * fVar255;
                        auVar221._8_4_ = fVar208 * fVar256;
                        auVar221._12_4_ = fVar223 * fVar257;
                        auVar11 = vsubps_avx(auVar221,auVar200);
                        auVar201._0_4_ = fVar191 * fVar44;
                        auVar201._4_4_ = fVar192 * fVar2;
                        auVar201._8_4_ = fVar208 * fVar204;
                        auVar201._12_4_ = fVar223 * fVar177;
                        auVar168._0_4_ = fVar70 * fVar71;
                        auVar168._4_4_ = fVar193 * fVar72;
                        auVar168._8_4_ = fVar205 * fVar172;
                        auVar168._12_4_ = fVar190 * fVar175;
                        auVar12 = vsubps_avx(auVar168,auVar201);
                        auVar94 = *(undefined1 (*) [16])(ray + 0x60);
                        fVar71 = auVar94._0_4_;
                        fVar172 = auVar94._4_4_;
                        fVar207 = auVar94._8_4_;
                        fVar191 = auVar94._12_4_;
                        fVar208 = *(float *)(ray + 0x50);
                        fVar223 = *(float *)(ray + 0x54);
                        fVar226 = *(float *)(ray + 0x58);
                        auVar16 = *(undefined1 (*) [12])(ray + 0x50);
                        fVar227 = *(float *)(ray + 0x5c);
                        pRVar1 = ray + 0x40;
                        auVar15 = *(undefined1 (*) [12])pRVar1;
                        fVar171 = *(float *)(ray + 0x4c);
                        _local_1b18 = *(undefined1 (*) [16])pRVar1;
                        fVar217 = auVar209._0_4_ * *(float *)pRVar1 +
                                  fVar208 * auVar11._0_4_ + auVar12._0_4_ * fVar71;
                        fVar225 = auVar209._4_4_ * *(float *)(ray + 0x44) +
                                  fVar223 * auVar11._4_4_ + auVar12._4_4_ * fVar172;
                        auVar222._0_8_ = CONCAT44(fVar225,fVar217);
                        auVar222._8_4_ =
                             auVar209._8_4_ * *(float *)(ray + 0x48) +
                             fVar226 * auVar11._8_4_ + auVar12._8_4_ * fVar207;
                        auVar222._12_4_ =
                             auVar209._12_4_ * fVar171 +
                             fVar227 * auVar11._12_4_ + auVar12._12_4_ * fVar191;
                        auVar94 = vsubps_avx(auVar146,auVar164);
                        auVar146 = vsubps_avx(auVar56,auVar194);
                        fVar72 = fVar242 + auVar164._0_4_;
                        fVar175 = fVar246 + auVar164._4_4_;
                        fVar206 = fVar248 + auVar164._8_4_;
                        fVar192 = fVar250 + auVar164._12_4_;
                        fVar174 = fVar258 + auVar194._0_4_;
                        fVar228 = fVar262 + auVar194._4_4_;
                        fVar231 = fVar263 + auVar194._8_4_;
                        fVar232 = fVar264 + auVar194._12_4_;
                        fVar213 = auVar146._0_4_;
                        auVar245._0_4_ = fVar213 * fVar72;
                        fVar214 = auVar146._4_4_;
                        auVar245._4_4_ = fVar214 * fVar175;
                        fVar215 = auVar146._8_4_;
                        auVar245._8_4_ = fVar215 * fVar206;
                        fVar216 = auVar146._12_4_;
                        auVar245._12_4_ = fVar216 * fVar192;
                        fVar224 = auVar94._0_4_;
                        auVar103._0_4_ = fVar224 * fVar174;
                        fVar237 = auVar94._4_4_;
                        auVar103._4_4_ = fVar237 * fVar228;
                        fVar239 = auVar94._8_4_;
                        auVar103._8_4_ = fVar239 * fVar231;
                        fVar241 = auVar94._12_4_;
                        auVar103._12_4_ = fVar241 * fVar232;
                        auVar94 = vsubps_avx(auVar103,auVar245);
                        auVar125 = vsubps_avx(auVar125,auVar134);
                        fVar243 = auVar125._0_4_;
                        auVar261._0_4_ = fVar243 * fVar174;
                        fVar247 = auVar125._4_4_;
                        auVar261._4_4_ = fVar247 * fVar228;
                        fVar249 = auVar125._8_4_;
                        auVar261._8_4_ = fVar249 * fVar231;
                        fVar251 = auVar125._12_4_;
                        auVar261._12_4_ = fVar251 * fVar232;
                        fVar174 = auVar134._0_4_ + fVar9;
                        fVar228 = auVar134._4_4_ + fVar10;
                        fVar231 = auVar134._8_4_ + fVar73;
                        fVar232 = auVar134._12_4_ + fVar98;
                        auVar202._0_4_ = fVar213 * fVar174;
                        auVar202._4_4_ = fVar214 * fVar228;
                        auVar202._8_4_ = fVar215 * fVar231;
                        auVar202._12_4_ = fVar216 * fVar232;
                        auVar125 = vsubps_avx(auVar202,auVar261);
                        auVar186._0_4_ = fVar224 * fVar174;
                        auVar186._4_4_ = fVar237 * fVar228;
                        auVar186._8_4_ = fVar239 * fVar231;
                        auVar186._12_4_ = fVar241 * fVar232;
                        auVar169._0_4_ = fVar243 * fVar72;
                        auVar169._4_4_ = fVar247 * fVar175;
                        auVar169._8_4_ = fVar249 * fVar206;
                        auVar169._12_4_ = fVar251 * fVar192;
                        auVar146 = vsubps_avx(auVar169,auVar186);
                        fVar234 = auVar15._0_4_;
                        fVar238 = auVar15._4_4_;
                        fVar240 = auVar15._8_4_;
                        auVar187._0_4_ =
                             fVar234 * auVar94._0_4_ +
                             auVar146._0_4_ * fVar71 + fVar208 * auVar125._0_4_;
                        auVar187._4_4_ =
                             fVar238 * auVar94._4_4_ +
                             auVar146._4_4_ * fVar172 + fVar223 * auVar125._4_4_;
                        auVar187._8_4_ =
                             fVar240 * auVar94._8_4_ +
                             auVar146._8_4_ * fVar207 + fVar226 * auVar125._8_4_;
                        auVar187._12_4_ =
                             fVar171 * auVar94._12_4_ +
                             auVar146._12_4_ * fVar191 + fVar227 * auVar125._12_4_;
                        auVar189 = ZEXT1664(auVar187);
                        auVar94 = vsubps_avx(auVar134,auVar195);
                        fVar233 = auVar134._0_4_ + auVar195._0_4_;
                        fVar99 = auVar134._4_4_ + auVar195._4_4_;
                        fVar119 = auVar134._8_4_ + auVar195._8_4_;
                        fVar121 = auVar134._12_4_ + auVar195._12_4_;
                        auVar125 = vsubps_avx(auVar164,auVar55);
                        fVar174 = auVar164._0_4_ + auVar55._0_4_;
                        fVar228 = auVar164._4_4_ + auVar55._4_4_;
                        fVar231 = auVar164._8_4_ + auVar55._8_4_;
                        fVar232 = auVar164._12_4_ + auVar55._12_4_;
                        auVar55 = vsubps_avx(auVar194,auVar133);
                        fVar123 = auVar194._0_4_ + auVar133._0_4_;
                        fVar120 = auVar194._4_4_ + auVar133._4_4_;
                        fVar122 = auVar194._8_4_ + auVar133._8_4_;
                        fVar124 = auVar194._12_4_ + auVar133._12_4_;
                        auVar212._8_4_ = 0x7fffffff;
                        auVar212._0_8_ = 0x7fffffff7fffffff;
                        auVar212._12_4_ = 0x7fffffff;
                        fVar72 = auVar55._0_4_;
                        auVar130._0_4_ = fVar174 * fVar72;
                        fVar175 = auVar55._4_4_;
                        auVar130._4_4_ = fVar228 * fVar175;
                        fVar206 = auVar55._8_4_;
                        auVar130._8_4_ = fVar231 * fVar206;
                        fVar192 = auVar55._12_4_;
                        auVar130._12_4_ = fVar232 * fVar192;
                        fVar163 = auVar125._0_4_;
                        auVar158._0_4_ = fVar163 * fVar123;
                        fVar170 = auVar125._4_4_;
                        auVar158._4_4_ = fVar170 * fVar120;
                        fVar173 = auVar125._8_4_;
                        auVar158._8_4_ = fVar173 * fVar122;
                        fVar176 = auVar125._12_4_;
                        auVar158._12_4_ = fVar176 * fVar124;
                        auVar55 = vsubps_avx(auVar158,auVar130);
                        fVar259 = auVar94._0_4_;
                        auVar104._0_4_ = fVar259 * fVar123;
                        fVar123 = auVar94._4_4_;
                        auVar104._4_4_ = fVar123 * fVar120;
                        fVar120 = auVar94._8_4_;
                        auVar104._8_4_ = fVar120 * fVar122;
                        fVar122 = auVar94._12_4_;
                        auVar104._12_4_ = fVar122 * fVar124;
                        auVar159._0_4_ = fVar233 * fVar72;
                        auVar159._4_4_ = fVar99 * fVar175;
                        auVar159._8_4_ = fVar119 * fVar206;
                        auVar159._12_4_ = fVar121 * fVar192;
                        auVar94 = vsubps_avx(auVar159,auVar104);
                        auVar85._0_4_ = fVar233 * fVar163;
                        auVar85._4_4_ = fVar99 * fVar170;
                        auVar85._8_4_ = fVar119 * fVar173;
                        auVar85._12_4_ = fVar121 * fVar176;
                        auVar57._0_4_ = fVar259 * fVar174;
                        auVar57._4_4_ = fVar123 * fVar228;
                        auVar57._8_4_ = fVar120 * fVar231;
                        auVar57._12_4_ = fVar122 * fVar232;
                        auVar133 = vsubps_avx(auVar57,auVar85);
                        auVar58._0_4_ =
                             fVar234 * auVar55._0_4_ +
                             fVar71 * auVar133._0_4_ + fVar208 * auVar94._0_4_;
                        auVar58._4_4_ =
                             fVar238 * auVar55._4_4_ +
                             fVar172 * auVar133._4_4_ + fVar223 * auVar94._4_4_;
                        auVar58._8_4_ =
                             fVar240 * auVar55._8_4_ +
                             fVar207 * auVar133._8_4_ + fVar226 * auVar94._8_4_;
                        auVar58._12_4_ =
                             fVar171 * auVar55._12_4_ +
                             fVar191 * auVar133._12_4_ + fVar227 * auVar94._12_4_;
                        auVar236._0_4_ = auVar58._0_4_ + fVar217 + auVar187._0_4_;
                        auVar236._4_4_ = auVar58._4_4_ + fVar225 + auVar187._4_4_;
                        auVar236._8_4_ = auVar58._8_4_ + auVar222._8_4_ + auVar187._8_4_;
                        auVar236._12_4_ = auVar58._12_4_ + auVar222._12_4_ + auVar187._12_4_;
                        auVar94 = vandps_avx(auVar236,auVar212);
                        auVar86._0_4_ = auVar94._0_4_ * 1.1920929e-07;
                        auVar86._4_4_ = auVar94._4_4_ * 1.1920929e-07;
                        auVar86._8_4_ = auVar94._8_4_ * 1.1920929e-07;
                        auVar86._12_4_ = auVar94._12_4_ * 1.1920929e-07;
                        auVar94 = vminps_avx(auVar222,auVar187);
                        auVar94 = vminps_avx(auVar94,auVar58);
                        uVar29 = CONCAT44(auVar86._4_4_,auVar86._0_4_);
                        auVar131._0_8_ = uVar29 ^ 0x8000000080000000;
                        auVar131._8_4_ = -auVar86._8_4_;
                        auVar131._12_4_ = -auVar86._12_4_;
                        auVar94 = vcmpps_avx(auVar94,auVar131,5);
                        auVar55 = vmaxps_avx(auVar222,auVar187);
                        auVar55 = vmaxps_avx(auVar55,auVar58);
                        auVar55 = vcmpps_avx(auVar55,auVar86,2);
                        auVar94 = vorps_avx(auVar94,auVar55);
                        auVar55 = auVar135 & auVar94;
                        auVar94 = vandps_avx(auVar94,auVar135);
                        if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar55[0xf] < '\0') {
                          auVar59._0_4_ = fVar224 * fVar252;
                          auVar59._4_4_ = fVar237 * fVar255;
                          auVar59._8_4_ = fVar239 * fVar256;
                          auVar59._12_4_ = fVar241 * fVar257;
                          auVar87._0_4_ = fVar213 * fVar44;
                          auVar87._4_4_ = fVar214 * fVar2;
                          auVar87._8_4_ = fVar215 * fVar204;
                          auVar87._12_4_ = fVar216 * fVar177;
                          auVar125 = vsubps_avx(auVar87,auVar59);
                          auVar105._0_4_ = fVar213 * fVar163;
                          auVar105._4_4_ = fVar214 * fVar170;
                          auVar105._8_4_ = fVar215 * fVar173;
                          auVar105._12_4_ = fVar216 * fVar176;
                          auVar132._0_4_ = fVar224 * fVar72;
                          auVar132._4_4_ = fVar237 * fVar175;
                          auVar132._8_4_ = fVar239 * fVar206;
                          auVar132._12_4_ = fVar241 * fVar192;
                          auVar146 = vsubps_avx(auVar132,auVar105);
                          auVar55 = vandps_avx(auVar212,auVar59);
                          auVar133 = vandps_avx(auVar212,auVar105);
                          auVar55 = vcmpps_avx(auVar55,auVar133,1);
                          auVar125 = vblendvps_avx(auVar146,auVar125,auVar55);
                          auVar60._0_4_ = fVar243 * fVar72;
                          auVar60._4_4_ = fVar247 * fVar175;
                          auVar60._8_4_ = fVar249 * fVar206;
                          auVar60._12_4_ = fVar251 * fVar192;
                          auVar88._0_4_ = fVar243 * fVar252;
                          auVar88._4_4_ = fVar247 * fVar255;
                          auVar88._8_4_ = fVar249 * fVar256;
                          auVar88._12_4_ = fVar251 * fVar257;
                          auVar106._0_4_ = fVar213 * fVar70;
                          auVar106._4_4_ = fVar214 * fVar193;
                          auVar106._8_4_ = fVar215 * fVar205;
                          auVar106._12_4_ = fVar216 * fVar190;
                          auVar146 = vsubps_avx(auVar88,auVar106);
                          auVar141._0_4_ = fVar259 * fVar213;
                          auVar141._4_4_ = fVar123 * fVar214;
                          auVar141._8_4_ = fVar120 * fVar215;
                          auVar141._12_4_ = fVar122 * fVar216;
                          auVar56 = vsubps_avx(auVar141,auVar60);
                          auVar55 = vandps_avx(auVar212,auVar106);
                          auVar133 = vandps_avx(auVar212,auVar60);
                          auVar55 = vcmpps_avx(auVar55,auVar133,1);
                          auVar146 = vblendvps_avx(auVar56,auVar146,auVar55);
                          auVar61._0_4_ = fVar259 * fVar224;
                          auVar61._4_4_ = fVar123 * fVar237;
                          auVar61._8_4_ = fVar120 * fVar239;
                          auVar61._12_4_ = fVar122 * fVar241;
                          auVar107._0_4_ = fVar224 * fVar70;
                          auVar107._4_4_ = fVar237 * fVar193;
                          auVar107._8_4_ = fVar239 * fVar205;
                          auVar107._12_4_ = fVar241 * fVar190;
                          auVar142._0_4_ = fVar243 * fVar44;
                          auVar142._4_4_ = fVar247 * fVar2;
                          auVar142._8_4_ = fVar249 * fVar204;
                          auVar142._12_4_ = fVar251 * fVar177;
                          auVar160._0_4_ = fVar243 * fVar163;
                          auVar160._4_4_ = fVar247 * fVar170;
                          auVar160._8_4_ = fVar249 * fVar173;
                          auVar160._12_4_ = fVar251 * fVar176;
                          auVar56 = vsubps_avx(auVar107,auVar142);
                          auVar134 = vsubps_avx(auVar160,auVar61);
                          auVar55 = vandps_avx(auVar212,auVar142);
                          auVar133 = vandps_avx(auVar212,auVar61);
                          auVar55 = vcmpps_avx(auVar55,auVar133,1);
                          auVar133 = vblendvps_avx(auVar134,auVar56,auVar55);
                          local_1c68._0_4_ = auVar16._0_4_;
                          local_1c68._4_4_ = auVar16._4_4_;
                          fStack_1c60 = auVar16._8_4_;
                          fVar44 = fVar234 * auVar125._0_4_ +
                                   auVar133._0_4_ * fVar71 +
                                   auVar146._0_4_ * (float)local_1c68._0_4_;
                          fVar70 = fVar238 * auVar125._4_4_ +
                                   auVar133._4_4_ * fVar172 +
                                   auVar146._4_4_ * (float)local_1c68._4_4_;
                          fVar71 = fVar240 * auVar125._8_4_ +
                                   auVar133._8_4_ * fVar207 + auVar146._8_4_ * fStack_1c60;
                          fVar72 = fVar171 * auVar125._12_4_ +
                                   auVar133._12_4_ * fVar191 + auVar146._12_4_ * fVar227;
                          auVar62._0_4_ = fVar44 + fVar44;
                          auVar62._4_4_ = fVar70 + fVar70;
                          auVar62._8_4_ = fVar71 + fVar71;
                          auVar62._12_4_ = fVar72 + fVar72;
                          fVar44 = auVar125._0_4_ * fVar9 +
                                   auVar133._0_4_ * fVar258 + auVar146._0_4_ * fVar242;
                          fVar70 = auVar125._4_4_ * fVar10 +
                                   auVar133._4_4_ * fVar262 + auVar146._4_4_ * fVar246;
                          fVar71 = auVar125._8_4_ * fVar73 +
                                   auVar133._8_4_ * fVar263 + auVar146._8_4_ * fVar248;
                          fVar72 = auVar125._12_4_ * fVar98 +
                                   auVar133._12_4_ * fVar264 + auVar146._12_4_ * fVar250;
                          auVar55 = vrcpps_avx(auVar62);
                          fVar9 = auVar55._0_4_;
                          auVar188._0_4_ = auVar62._0_4_ * fVar9;
                          fVar10 = auVar55._4_4_;
                          auVar188._4_4_ = auVar62._4_4_ * fVar10;
                          fVar73 = auVar55._8_4_;
                          auVar188._8_4_ = auVar62._8_4_ * fVar73;
                          fVar98 = auVar55._12_4_;
                          auVar188._12_4_ = auVar62._12_4_ * fVar98;
                          auVar203._8_4_ = 0x3f800000;
                          auVar203._0_8_ = 0x3f8000003f800000;
                          auVar203._12_4_ = 0x3f800000;
                          auVar55 = vsubps_avx(auVar203,auVar188);
                          auVar108._0_4_ = (fVar44 + fVar44) * (fVar9 + fVar9 * auVar55._0_4_);
                          auVar108._4_4_ = (fVar70 + fVar70) * (fVar10 + fVar10 * auVar55._4_4_);
                          auVar108._8_4_ = (fVar71 + fVar71) * (fVar73 + fVar73 * auVar55._8_4_);
                          auVar108._12_4_ = (fVar72 + fVar72) * (fVar98 + fVar98 * auVar55._12_4_);
                          auVar55 = vcmpps_avx(auVar108,*(undefined1 (*) [16])(ray + 0x80),2);
                          auVar189 = ZEXT1664(auVar55);
                          auVar56 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar108,2);
                          auVar55 = vandps_avx(auVar56,auVar55);
                          auVar56 = vcmpps_avx(auVar62,_DAT_01f45a50,4);
                          auVar55 = vandps_avx(auVar56,auVar55);
                          auVar55 = vpslld_avx(auVar55,0x1f);
                          auVar56 = vpsrad_avx(auVar55,0x1f);
                          auVar55 = auVar94 & auVar56;
                          auVar94 = vandps_avx(auVar94,auVar56);
                          if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar55 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar55[0xf] < '\0') {
                            uStack_1bd0 = auVar222._8_8_;
                            uStack_17d0 = uStack_1bd0;
                            local_1838 = auVar133;
                            local_1828 = auVar146;
                            local_1818 = auVar125;
                            local_1808 = auVar108;
                            local_17f8 = auVar236;
                            _local_17e8 = auVar187;
                            local_17d8 = auVar222._0_8_;
                          }
                        }
                        uVar5 = (pre.super_Precalculations.grid)->_geomID;
                        pGVar6 = (context->scene->geometries).items[uVar5].ptr;
                        uVar3 = pGVar6->mask;
                        auVar89._4_4_ = uVar3;
                        auVar89._0_4_ = uVar3;
                        auVar89._8_4_ = uVar3;
                        auVar89._12_4_ = uVar3;
                        auVar55 = vandps_avx(auVar89,*(undefined1 (*) [16])(ray + 0x90));
                        auVar55 = vpcmpeqd_avx(auVar55,_DAT_01f45a50);
                        auVar133 = auVar94 & ~auVar55;
                        if ((((auVar133 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar133 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar133 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar133[0xf] < '\0') {
                          uVar3 = (pre.super_Precalculations.grid)->_primID;
                          auVar94 = vandnps_avx(auVar55,auVar94);
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar65._8_4_ = 0x7fffffff;
                            auVar65._0_8_ = 0x7fffffff7fffffff;
                            auVar65._12_4_ = 0x7fffffff;
                            auVar55 = vandps_avx(local_17f8,auVar65);
                            auVar133 = vrcpps_avx(local_17f8);
                            fVar9 = auVar133._0_4_;
                            auVar112._0_4_ = local_17f8._0_4_ * fVar9;
                            fVar10 = auVar133._4_4_;
                            auVar112._4_4_ = local_17f8._4_4_ * fVar10;
                            fVar73 = auVar133._8_4_;
                            auVar112._8_4_ = local_17f8._8_4_ * fVar73;
                            fVar98 = auVar133._12_4_;
                            auVar112._12_4_ = local_17f8._12_4_ * fVar98;
                            auVar162._8_4_ = 0x3f800000;
                            auVar162._0_8_ = 0x3f8000003f800000;
                            auVar162._12_4_ = 0x3f800000;
                            auVar133 = vsubps_avx(auVar162,auVar112);
                            auVar92._0_4_ = fVar9 + fVar9 * auVar133._0_4_;
                            auVar92._4_4_ = fVar10 + fVar10 * auVar133._4_4_;
                            auVar92._8_4_ = fVar73 + fVar73 * auVar133._8_4_;
                            auVar92._12_4_ = fVar98 + fVar98 * auVar133._12_4_;
                            auVar113._8_4_ = 0x219392ef;
                            auVar113._0_8_ = 0x219392ef219392ef;
                            auVar113._12_4_ = 0x219392ef;
                            auVar55 = vcmpps_avx(auVar55,auVar113,5);
                            auVar55 = vandps_avx(auVar55,auVar92);
                            auVar66._0_4_ = auVar55._0_4_ * (float)local_17d8;
                            auVar66._4_4_ = auVar55._4_4_ * local_17d8._4_4_;
                            auVar66._8_4_ = auVar55._8_4_ * (float)uStack_17d0;
                            auVar66._12_4_ = auVar55._12_4_ * uStack_17d0._4_4_;
                            auVar164 = vminps_avx(auVar66,auVar162);
                            auVar93._0_4_ = auVar55._0_4_ * (float)local_17e8._0_4_;
                            auVar93._4_4_ = auVar55._4_4_ * (float)local_17e8._4_4_;
                            auVar93._8_4_ = auVar55._8_4_ * fStack_17e0;
                            auVar93._12_4_ = auVar55._12_4_ * fStack_17dc;
                            auVar194 = vminps_avx(auVar93,auVar162);
                            uVar23 = *(undefined4 *)(local_1b68 + lVar26 + 0x2c);
                            auVar114._4_4_ = uVar23;
                            auVar114._0_4_ = uVar23;
                            auVar114._8_4_ = uVar23;
                            auVar114._12_4_ = uVar23;
                            auVar133 = vpsrld_avx(auVar114,0x10);
                            auVar56 = ZEXT816(0) << 0x40;
                            auVar55 = vpblendw_avx(auVar114,auVar56,0xaa);
                            auVar55 = vcvtdq2ps_avx(auVar55);
                            auVar133 = vcvtdq2ps_avx(auVar133);
                            uVar23 = *(undefined4 *)(local_1b68 + lVar26 + 0x30);
                            auVar145._4_4_ = uVar23;
                            auVar145._0_4_ = uVar23;
                            auVar145._8_4_ = uVar23;
                            auVar145._12_4_ = uVar23;
                            auVar125 = vsubps_avx(auVar162,auVar164);
                            auVar195 = vsubps_avx(auVar125,auVar194);
                            auVar125 = vpblendw_avx(auVar145,auVar56,0xaa);
                            auVar125 = vcvtdq2ps_avx(auVar125);
                            auVar146 = vpsrld_avx(auVar145,0x10);
                            auVar146 = vcvtdq2ps_avx(auVar146);
                            uVar23 = *(undefined4 *)(local_1bf0 + lVar26);
                            auVar147._4_4_ = uVar23;
                            auVar147._0_4_ = uVar23;
                            auVar147._8_4_ = uVar23;
                            auVar147._12_4_ = uVar23;
                            auVar56 = vpblendw_avx(auVar147,auVar56,0xaa);
                            auVar56 = vcvtdq2ps_avx(auVar56);
                            auVar134 = vpsrld_avx(auVar147,0x10);
                            auVar134 = vcvtdq2ps_avx(auVar134);
                            local_1a38._0_8_ = local_1818._0_8_;
                            local_1a38._8_8_ = local_1818._8_8_;
                            local_1a38._16_8_ = local_1828._0_8_;
                            local_1a38._24_8_ = local_1828._8_8_;
                            local_1a38._32_8_ = local_1838._0_8_;
                            local_1a38._40_8_ = local_1838._8_8_;
                            local_1a08 = local_1808._0_8_;
                            uStack_1a00 = local_1808._8_8_;
                            local_19f8._4_4_ =
                                 auVar164._4_4_ * auVar134._4_4_ * 0.00012207031 +
                                 auVar195._4_4_ * auVar133._4_4_ * 0.00012207031 +
                                 auVar194._4_4_ * auVar146._4_4_ * 0.00012207031;
                            local_19f8._0_4_ =
                                 auVar164._0_4_ * auVar134._0_4_ * 0.00012207031 +
                                 auVar195._0_4_ * auVar133._0_4_ * 0.00012207031 +
                                 auVar194._0_4_ * auVar146._0_4_ * 0.00012207031;
                            fStack_19f0 = auVar164._8_4_ * auVar134._8_4_ * 0.00012207031 +
                                          auVar195._8_4_ * auVar133._8_4_ * 0.00012207031 +
                                          auVar194._8_4_ * auVar146._8_4_ * 0.00012207031;
                            fStack_19ec = auVar164._12_4_ * auVar134._12_4_ * 0.00012207031 +
                                          auVar195._12_4_ * auVar133._12_4_ * 0.00012207031 +
                                          auVar194._12_4_ * auVar146._12_4_ * 0.00012207031;
                            local_19e8._4_4_ =
                                 auVar164._4_4_ * auVar56._4_4_ * 0.00012207031 +
                                 auVar195._4_4_ * auVar55._4_4_ * 0.00012207031 +
                                 auVar194._4_4_ * auVar125._4_4_ * 0.00012207031;
                            local_19e8._0_4_ =
                                 auVar164._0_4_ * auVar56._0_4_ * 0.00012207031 +
                                 auVar195._0_4_ * auVar55._0_4_ * 0.00012207031 +
                                 auVar194._0_4_ * auVar125._0_4_ * 0.00012207031;
                            fStack_19e0 = auVar164._8_4_ * auVar56._8_4_ * 0.00012207031 +
                                          auVar195._8_4_ * auVar55._8_4_ * 0.00012207031 +
                                          auVar194._8_4_ * auVar125._8_4_ * 0.00012207031;
                            fStack_19dc = auVar164._12_4_ * auVar56._12_4_ * 0.00012207031 +
                                          auVar195._12_4_ * auVar55._12_4_ * 0.00012207031 +
                                          auVar194._12_4_ * auVar125._12_4_ * 0.00012207031;
                            args.valid = (int *)&Ng;
                            args.geometryUserPtr = &t;
                            args.context = (RTCRayQueryContext *)&v;
                            args.ray = (RTCRayN *)&u;
                            auVar189 = ZEXT1664(CONCAT412(0x39000000,
                                                          CONCAT48(0x39000000,0x3900000039000000)));
                            _local_1b18 = auVar94;
                            std::
                            _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                            ::
                            _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                      ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                        *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                 *)&local_1a38.field_0);
                            local_19d8 = vpshufd_avx(ZEXT416(uVar5),0);
                            _local_19e8 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
                            local_1a38._0_8_ = Ng.field_0._0_8_;
                            local_1a38._8_8_ = Ng.field_0._8_8_;
                            local_1a38._16_8_ = Ng.field_0._16_8_;
                            local_1a38._24_8_ = Ng.field_0._24_8_;
                            local_1a38._32_8_ = Ng.field_0._32_8_;
                            local_1a38._40_8_ = Ng.field_0._40_8_;
                            local_1a08 = u.field_0._0_8_;
                            uStack_1a00 = u.field_0._8_8_;
                            _local_19f8 = v.field_0;
                            vcmpps_avx(ZEXT1632(local_19d8),ZEXT1632(local_19d8),0xf);
                            uStack_19c4 = context->user->instID[0];
                            local_19c8 = uStack_19c4;
                            uStack_19c0 = uStack_19c4;
                            uStack_19bc = uStack_19c4;
                            uStack_19b8 = context->user->instPrimID[0];
                            uStack_19b4 = uStack_19b8;
                            uStack_19b0 = uStack_19b8;
                            uStack_19ac = uStack_19b8;
                            auVar55 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar94 = vblendvps_avx(auVar55,(undefined1  [16])t.field_0,_local_1b18)
                            ;
                            *(undefined1 (*) [16])(ray + 0x80) = auVar94;
                            local_1b88 = _local_1b18;
                            args.valid = (int *)local_1b88;
                            args.geometryUserPtr = pGVar6->userPtr;
                            args.context = context->user;
                            args.hit = (RTCHitN *)&local_1a38;
                            args.N = 4;
                            args.ray = (RTCRayN *)ray;
                            if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar189 = ZEXT1664(auVar189._0_16_);
                              auVar68._0_8_ = (*pGVar6->occlusionFilterN)(&args);
                              auVar68._8_56_ = extraout_var_01;
                              auVar94 = auVar68._0_16_;
                            }
                            if (local_1b88 == (undefined1  [16])0x0) {
                              auVar94 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                              auVar94 = auVar94 ^ _DAT_01f46b70;
                            }
                            else {
                              p_Var7 = context->args->filter;
                              if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar189 = ZEXT1664(auVar189._0_16_);
                                auVar69._0_8_ = (*p_Var7)(&args);
                                auVar69._8_56_ = extraout_var_02;
                                auVar94 = auVar69._0_16_;
                              }
                              auVar133 = vpcmpeqd_avx(local_1b88,_DAT_01f45a50);
                              auVar94 = vpcmpeqd_avx(auVar94,auVar94);
                              auVar94 = auVar133 ^ auVar94;
                              auVar116._8_4_ = 0xff800000;
                              auVar116._0_8_ = 0xff800000ff800000;
                              auVar116._12_4_ = 0xff800000;
                              auVar133 = vblendvps_avx(auVar116,*(undefined1 (*) [16])
                                                                 (args.ray + 0x80),auVar133);
                              *(undefined1 (*) [16])(args.ray + 0x80) = auVar133;
                            }
                            auVar133 = vpslld_avx(auVar94,0x1f);
                            auVar94 = vpsrad_avx(auVar133,0x1f);
                            auVar55 = vblendvps_avx(auVar55,*(undefined1 (*) [16])local_1b70,
                                                    auVar133);
                            *(undefined1 (*) [16])local_1b70 = auVar55;
                          }
                          auVar135 = vpandn_avx(auVar94,auVar135);
                        }
                        auVar97 = ZEXT1664(auVar135);
                        lVar26 = lVar26 + 4;
                      } while ((((auVar135 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                || (auVar135 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar135 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || auVar135[0xf] < '\0');
                      local_1b68 = local_1b68 + lVar32;
                      local_1b30 = local_1b30 + lVar32;
                      local_1b38 = local_1b38 + lVar32;
                      local_1b40 = local_1b40 + lVar32;
                      local_1b50 = local_1b50 + lVar32;
                      local_1b58 = local_1b58 + lVar32;
                      local_1b48 = local_1b48 + lVar32;
                      local_1bf0 = local_1bf0 + lVar32;
                      pcVar38 = pcVar38 + lVar32;
                      local_1ac8 = local_1ac8 + lVar32;
                      pcVar33 = pcVar33 + lVar32;
                      local_1ac0 = local_1ac0 + lVar32;
                      local_1ad0 = local_1ad0 + lVar32;
                      pcVar40 = pcVar40 + lVar32;
                    }
                    local_1848 = auVar95._0_4_;
                    uStack_1844 = auVar95._4_4_;
                    uStack_1840 = auVar95._8_4_;
                    uStack_183c = auVar95._12_4_;
                    local_1868 = auVar118._0_4_;
                    uStack_1864 = auVar118._4_4_;
                    uStack_1860 = auVar118._8_4_;
                    uStack_185c = auVar118._12_4_;
                    auVar95._0_4_ = local_1848 ^ local_1868;
                    auVar95._4_4_ = uStack_1844 ^ uStack_1864;
                    auVar95._8_4_ = uStack_1840 ^ uStack_1860;
                    auVar95._12_4_ = uStack_183c ^ uStack_185c;
                    auVar118 = vpor_avx(auVar97._0_16_,auVar118 ^ auVar75);
                    auVar67 = vpand_avx(auVar118,auVar67);
                  }
                  auVar118 = vpcmpeqd_avx(auVar95,auVar95);
                  auVar67 = auVar67 ^ auVar118;
                  sVar28 = 0;
                }
                else {
                  pre.super_Precalculations.grid = *(GridSOA **)(root.ptr & 0xfffffffffffffff0);
                  sVar28 = ((pre.super_Precalculations.grid)->troot).ptr;
                  auVar67._8_8_ = uVar20;
                  auVar67._0_8_ = uVar19;
                  auVar118 = vpcmpeqd_avx(auVar118,auVar118);
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vpor_avx(auVar67,(undefined1  [16])terminated.field_0);
                auVar118 = auVar118 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar118 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar118 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar118 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar118[0xf]) goto LAB_00ece64d;
                auVar117._8_4_ = 0xff800000;
                auVar117._0_8_ = 0xff800000ff800000;
                auVar117._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar117,
                                   (undefined1  [16])terminated.field_0);
                if (sVar28 != 0) {
                  local_1b78->ptr = sVar28;
                  local_1b78 = local_1b78 + 1;
                  paVar36->i[0] = -0x800000;
                  paVar36->i[1] = -0x800000;
                  paVar36->i[2] = -0x800000;
                  paVar36->i[3] = -0x800000;
                  paVar36 = paVar36 + 1;
                }
              }
              goto LAB_00ecc997;
            }
            uVar25 = root.ptr & 0xfffffffffffffff0;
            auVar118 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar118,6);
            auVar97 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            root.ptr = 8;
            for (; (aVar74 = auVar97._0_16_, lVar32 != 0 &&
                   (sVar28 = *(size_t *)(uVar25 + 0x20 + lVar32 * 2), sVar28 != 8));
                lVar32 = lVar32 + 4) {
              fVar9 = *(float *)(uVar25 + 0x90 + lVar32);
              fVar10 = *(float *)(uVar25 + 0x30 + lVar32);
              auVar75 = *(undefined1 (*) [16])(ray + 0x70);
              fVar73 = auVar75._0_4_;
              fVar98 = auVar75._4_4_;
              fVar44 = auVar75._8_4_;
              fVar70 = auVar75._12_4_;
              auVar100._0_4_ = fVar73 * fVar9 + fVar10;
              auVar100._4_4_ = fVar98 * fVar9 + fVar10;
              auVar100._8_4_ = fVar44 * fVar9 + fVar10;
              auVar100._12_4_ = fVar70 * fVar9 + fVar10;
              fVar9 = *(float *)(uVar25 + 0xb0 + lVar32);
              fVar10 = *(float *)(uVar25 + 0x50 + lVar32);
              auVar126._0_4_ = fVar73 * fVar9 + fVar10;
              auVar126._4_4_ = fVar98 * fVar9 + fVar10;
              auVar126._8_4_ = fVar44 * fVar9 + fVar10;
              auVar126._12_4_ = fVar70 * fVar9 + fVar10;
              fVar9 = *(float *)(uVar25 + 0xd0 + lVar32);
              fVar10 = *(float *)(uVar25 + 0x70 + lVar32);
              auVar136._0_4_ = fVar73 * fVar9 + fVar10;
              auVar136._4_4_ = fVar98 * fVar9 + fVar10;
              auVar136._8_4_ = fVar44 * fVar9 + fVar10;
              auVar136._12_4_ = fVar70 * fVar9 + fVar10;
              fVar9 = *(float *)(uVar25 + 0xa0 + lVar32);
              fVar10 = *(float *)(uVar25 + 0x40 + lVar32);
              auVar148._0_4_ = fVar73 * fVar9 + fVar10;
              auVar148._4_4_ = fVar98 * fVar9 + fVar10;
              auVar148._8_4_ = fVar44 * fVar9 + fVar10;
              auVar148._12_4_ = fVar70 * fVar9 + fVar10;
              fVar9 = *(float *)(uVar25 + 0xc0 + lVar32);
              fVar10 = *(float *)(uVar25 + 0x60 + lVar32);
              auVar165._0_4_ = fVar73 * fVar9 + fVar10;
              auVar165._4_4_ = fVar98 * fVar9 + fVar10;
              auVar165._8_4_ = fVar44 * fVar9 + fVar10;
              auVar165._12_4_ = fVar70 * fVar9 + fVar10;
              fVar9 = *(float *)(uVar25 + 0xe0 + lVar32);
              fVar10 = *(float *)(uVar25 + 0x80 + lVar32);
              auVar178._0_4_ = fVar10 + fVar73 * fVar9;
              auVar178._4_4_ = fVar10 + fVar98 * fVar9;
              auVar178._8_4_ = fVar10 + fVar44 * fVar9;
              auVar178._12_4_ = fVar10 + fVar70 * fVar9;
              auVar189 = ZEXT1664(auVar178);
              auVar11._8_8_ = tray.org.field_0._8_8_;
              auVar11._0_8_ = tray.org.field_0._0_8_;
              auVar12._8_8_ = tray.org.field_0._24_8_;
              auVar12._0_8_ = tray.org.field_0._16_8_;
              auVar13._8_8_ = tray.org.field_0._40_8_;
              auVar13._0_8_ = tray.org.field_0._32_8_;
              auVar94 = vsubps_avx(auVar100,auVar11);
              auVar235._0_4_ = tray.rdir.field_0._0_4_ * auVar94._0_4_;
              auVar235._4_4_ = tray.rdir.field_0._4_4_ * auVar94._4_4_;
              auVar235._8_4_ = tray.rdir.field_0._8_4_ * auVar94._8_4_;
              auVar235._12_4_ = tray.rdir.field_0._12_4_ * auVar94._12_4_;
              auVar94 = vsubps_avx(auVar126,auVar12);
              auVar244._0_4_ = auVar94._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar244._4_4_ = auVar94._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar244._8_4_ = auVar94._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar244._12_4_ = auVar94._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar94 = vsubps_avx(auVar136,auVar13);
              auVar253._0_4_ = auVar94._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar253._4_4_ = auVar94._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar253._8_4_ = auVar94._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar253._12_4_ = auVar94._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar94 = vsubps_avx(auVar148,auVar11);
              auVar149._0_4_ = tray.rdir.field_0._0_4_ * auVar94._0_4_;
              auVar149._4_4_ = tray.rdir.field_0._4_4_ * auVar94._4_4_;
              auVar149._8_4_ = tray.rdir.field_0._8_4_ * auVar94._8_4_;
              auVar149._12_4_ = tray.rdir.field_0._12_4_ * auVar94._12_4_;
              auVar94 = vsubps_avx(auVar165,auVar12);
              auVar127._0_4_ = auVar94._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar127._4_4_ = auVar94._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar127._8_4_ = auVar94._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar127._12_4_ = auVar94._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar94 = vsubps_avx(auVar178,auVar13);
              auVar137._0_4_ = auVar94._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar137._4_4_ = auVar94._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar137._8_4_ = auVar94._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar137._12_4_ = auVar94._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar94 = vpminsd_avx(auVar235,auVar149);
              auVar55 = vpminsd_avx(auVar244,auVar127);
              auVar94 = vpmaxsd_avx(auVar94,auVar55);
              auVar55 = vpminsd_avx(auVar253,auVar137);
              auVar94 = vpmaxsd_avx(auVar94,auVar55);
              auVar55 = vpmaxsd_avx(auVar235,auVar149);
              auVar133 = vpmaxsd_avx(auVar244,auVar127);
              auVar135 = vpminsd_avx(auVar55,auVar133);
              auVar55 = vpmaxsd_avx(auVar253,auVar137);
              auVar133 = vpmaxsd_avx(auVar94,(undefined1  [16])tray.tnear.field_0);
              auVar55 = vpminsd_avx(auVar135,auVar55);
              auVar55 = vpminsd_avx(auVar55,(undefined1  [16])tray.tfar.field_0);
              if ((uVar22 & 7) == 6) {
                auVar55 = vcmpps_avx(auVar133,auVar55,2);
                uVar23 = *(undefined4 *)(uVar25 + 0xf0 + lVar32);
                auVar138._4_4_ = uVar23;
                auVar138._0_4_ = uVar23;
                auVar138._8_4_ = uVar23;
                auVar138._12_4_ = uVar23;
                auVar133 = vcmpps_avx(auVar138,auVar75,2);
                uVar23 = *(undefined4 *)(uVar25 + 0x100 + lVar32);
                auVar150._4_4_ = uVar23;
                auVar150._0_4_ = uVar23;
                auVar150._8_4_ = uVar23;
                auVar150._12_4_ = uVar23;
                auVar75 = vcmpps_avx(auVar75,auVar150,1);
                auVar75 = vandps_avx(auVar133,auVar75);
                auVar75 = vandps_avx(auVar75,auVar55);
              }
              else {
                auVar75 = vcmpps_avx(auVar133,auVar55,2);
              }
              auVar75 = vandps_avx(auVar75,auVar118);
              auVar75 = vpslld_avx(auVar75,0x1f);
              if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar75[0xf]) {
                auVar97 = ZEXT1664((undefined1  [16])aVar74);
                sVar28 = root.ptr;
              }
              else {
                auVar128._8_4_ = 0x7f800000;
                auVar128._0_8_ = 0x7f8000007f800000;
                auVar128._12_4_ = 0x7f800000;
                auVar75 = vblendvps_avx(auVar128,auVar94,auVar75);
                auVar97 = ZEXT1664(auVar75);
                if (root.ptr != 8) {
                  local_1b78->ptr = root.ptr;
                  local_1b78 = local_1b78 + 1;
                  *paVar36 = aVar74;
                  paVar36 = paVar36 + 1;
                }
              }
              root.ptr = sVar28;
            }
            if (root.ptr == 8) goto LAB_00eccc33;
            auVar118 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar74,6);
            uVar23 = vmovmskps_avx(auVar118);
          } while ((byte)uVar31 < (byte)POPCOUNT(uVar23));
          local_1b78->ptr = root.ptr;
          local_1b78 = local_1b78 + 1;
          *paVar36 = aVar74;
          paVar36 = paVar36 + 1;
LAB_00eccc33:
          iVar24 = 4;
        }
        else {
          while (uVar25 != 0) {
            sVar28 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> sVar28 & 1) == 0; sVar28 = sVar28 + 1) {
              }
            }
            uVar25 = uVar25 & uVar25 - 1;
            auVar189 = ZEXT1664(auVar189._0_16_);
            bVar21 = occluded1(This,bvh,root,sVar28,&pre,ray,&tray,context);
            if (bVar21) {
              terminated.field_0.i[sVar28] = -1;
            }
          }
          auVar118 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar24 = 3;
          if ((((auVar118 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar118 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar118 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar118[0xf] < '\0') {
            auVar118._8_4_ = 0xff800000;
            auVar118._0_8_ = 0xff800000ff800000;
            auVar118._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar118,
                               (undefined1  [16])terminated.field_0);
            iVar24 = 2;
          }
          auVar97 = ZEXT1664((undefined1  [16])vVar4.field_0);
          if (uVar31 < uVar22) goto LAB_00ecc9db;
        }
      } while ((iVar24 == 4) || (iVar24 == 2));
LAB_00ece64d:
      auVar8 = vandps_avx(auVar8,(undefined1  [16])terminated.field_0);
      auVar96._8_4_ = 0xff800000;
      auVar96._0_8_ = 0xff800000ff800000;
      auVar96._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar96);
      *(undefined1 (*) [16])local_1b70 = auVar8;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }